

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_3D_K.H
# Opt level: O0

void amrex::mlndlap_bc_doit<int>
               (Box *vbx,Array4<int> *a,Box *domain,GpuArray<bool,_3U> *bflo,
               GpuArray<bool,_3U> *bfhi)

{
  undefined8 uVar1;
  bool bVar2;
  byte *in_RCX;
  Box *in_RDX;
  long *in_RSI;
  Box *in_RDI;
  byte *in_R8;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box result;
  Box *sbox;
  Dim3 dhi;
  Dim3 dlo;
  int offset;
  int idim;
  Box gdomain;
  IntVect local_2150;
  int local_2144;
  int local_2140;
  int local_213c;
  undefined8 local_2138;
  int local_2130;
  undefined8 local_2124;
  int local_211c;
  int local_2118 [2];
  int local_2110;
  int local_2108;
  int iStack_2104;
  int local_2100;
  Box local_20f8;
  Box *local_20d8;
  undefined8 local_20d0;
  int local_20c8;
  undefined8 local_20c0;
  int local_20b8;
  undefined8 local_20b0;
  int local_20a8;
  undefined8 local_20a0;
  int local_2098;
  uint local_2094;
  int local_2090;
  Box local_208c;
  byte *local_2070;
  byte *local_2068;
  Box *local_2060;
  long *local_2058;
  Box *local_2050;
  int local_2048 [2];
  int local_2040;
  Box *local_2038;
  int local_202c;
  int iStack_2028;
  int local_2024;
  undefined8 local_2020;
  int local_2018;
  Box *local_2010;
  int local_2004;
  int iStack_2000;
  int local_1ffc;
  undefined8 local_1ff8;
  int local_1ff0;
  Box *local_1fe8;
  int local_1fdc;
  int iStack_1fd8;
  int local_1fd4;
  undefined8 local_1fd0;
  int local_1fc8;
  Box *local_1fc0;
  int local_1fb8;
  int iStack_1fb4;
  int local_1fb0;
  undefined4 local_1fac;
  Box *local_1fa8;
  int local_1f9c;
  int local_1f98;
  int local_1f94;
  long *local_1f90;
  int local_1f84;
  int local_1f80;
  int local_1f7c;
  long *local_1f78;
  int local_1f6c;
  int local_1f68;
  int local_1f64;
  long *local_1f60;
  int local_1f54;
  int local_1f50;
  int local_1f4c;
  long *local_1f48;
  int local_1f3c;
  int local_1f38;
  int local_1f34;
  long *local_1f30;
  int local_1f24;
  int local_1f20;
  int local_1f1c;
  long *local_1f18;
  int local_1f0c;
  int local_1f08;
  int local_1f04;
  long *local_1f00;
  int local_1ef4;
  int local_1ef0;
  int local_1eec;
  long *local_1ee8;
  int local_1edc;
  int local_1ed8;
  int local_1ed4;
  long *local_1ed0;
  int local_1ec4;
  int local_1ec0;
  int local_1ebc;
  long *local_1eb8;
  int local_1eac;
  int local_1ea8;
  int local_1ea4;
  long *local_1ea0;
  int local_1e94;
  int local_1e90;
  int local_1e8c;
  long *local_1e88;
  int local_1e7c;
  int local_1e78;
  int local_1e74;
  long *local_1e70;
  int local_1e64;
  int local_1e60;
  int local_1e5c;
  long *local_1e58;
  int local_1e4c;
  int local_1e48;
  int local_1e44;
  long *local_1e40;
  int local_1e34;
  int local_1e30;
  int local_1e2c;
  long *local_1e28;
  int local_1e1c;
  int local_1e18;
  int local_1e14;
  long *local_1e10;
  int local_1e04;
  int local_1e00;
  int local_1dfc;
  long *local_1df8;
  int local_1dec;
  int local_1de8;
  int local_1de4;
  long *local_1de0;
  int local_1dd4;
  int local_1dd0;
  int local_1dcc;
  long *local_1dc8;
  int local_1dbc;
  int local_1db8;
  int local_1db4;
  long *local_1db0;
  int local_1da4;
  int local_1da0;
  int local_1d9c;
  long *local_1d98;
  int local_1d8c;
  int local_1d88;
  int local_1d84;
  long *local_1d80;
  int local_1d74;
  int local_1d70;
  int local_1d6c;
  long *local_1d68;
  int local_1d5c;
  int local_1d58;
  int local_1d54;
  long *local_1d50;
  int local_1d44;
  int local_1d40;
  int local_1d3c;
  long *local_1d38;
  int local_1d2c;
  int local_1d28;
  int local_1d24;
  long *local_1d20;
  int local_1d14;
  int local_1d10;
  int local_1d0c;
  long *local_1d08;
  int local_1cfc;
  int local_1cf8;
  int local_1cf4;
  long *local_1cf0;
  int local_1ce4;
  int local_1ce0;
  int local_1cdc;
  long *local_1cd8;
  int local_1ccc;
  int local_1cc8;
  int local_1cc4;
  long *local_1cc0;
  int local_1cb4;
  int local_1cb0;
  int local_1cac;
  long *local_1ca8;
  int local_1c9c;
  int local_1c98;
  int local_1c94;
  long *local_1c90;
  int local_1c84;
  int local_1c80;
  int local_1c7c;
  long *local_1c78;
  int local_1c6c;
  int local_1c68;
  int local_1c64;
  long *local_1c60;
  int local_1c54;
  int local_1c50;
  int local_1c4c;
  long *local_1c48;
  int local_1c3c;
  int local_1c38;
  int local_1c34;
  long *local_1c30;
  int local_1c24;
  int local_1c20;
  int local_1c1c;
  long *local_1c18;
  int local_1c0c;
  int local_1c08;
  int local_1c04;
  long *local_1c00;
  int local_1bf4;
  int local_1bf0;
  int local_1bec;
  long *local_1be8;
  int local_1bdc;
  int local_1bd8;
  int local_1bd4;
  long *local_1bd0;
  int local_1bc4;
  int local_1bc0;
  int local_1bbc;
  long *local_1bb8;
  int local_1bac;
  int local_1ba8;
  int local_1ba4;
  long *local_1ba0;
  int local_1b94;
  int local_1b90;
  int local_1b8c;
  long *local_1b88;
  int local_1b7c;
  int local_1b78;
  int local_1b74;
  long *local_1b70;
  int local_1b64;
  int local_1b60;
  int local_1b5c;
  long *local_1b58;
  int local_1b4c;
  int local_1b48;
  int local_1b44;
  long *local_1b40;
  int local_1b34;
  int local_1b30;
  int local_1b2c;
  long *local_1b28;
  int local_1b1c;
  int local_1b18;
  int local_1b14;
  long *local_1b10;
  int local_1b04;
  int local_1b00;
  int local_1afc;
  long *local_1af8;
  int local_1aec;
  int local_1ae8;
  int local_1ae4;
  long *local_1ae0;
  int local_1ad4;
  int local_1ad0;
  int local_1acc;
  long *local_1ac8;
  int local_1abc;
  int local_1ab8;
  int local_1ab4;
  long *local_1ab0;
  int local_1aa4;
  int local_1aa0;
  int local_1a9c;
  long *local_1a98;
  int local_1a8c;
  int local_1a88;
  int local_1a84;
  long *local_1a80;
  int local_1a74;
  int local_1a70;
  int local_1a6c;
  long *local_1a68;
  int local_1a5c;
  int local_1a58;
  int local_1a54;
  long *local_1a50;
  int local_1a44;
  int local_1a40;
  int local_1a3c;
  long *local_1a38;
  int local_1a2c;
  int local_1a28;
  int local_1a24;
  long *local_1a20;
  int local_1a14;
  int local_1a10;
  int local_1a0c;
  long *local_1a08;
  int local_19fc;
  int local_19f8;
  int local_19f4;
  long *local_19f0;
  int local_19e4;
  int local_19e0;
  int local_19dc;
  long *local_19d8;
  int local_19cc;
  int local_19c8;
  int local_19c4;
  long *local_19c0;
  int local_19b4;
  int local_19b0;
  int local_19ac;
  long *local_19a8;
  int local_199c;
  int local_1998;
  int local_1994;
  long *local_1990;
  int local_1984;
  int local_1980;
  int local_197c;
  long *local_1978;
  int local_196c;
  int local_1968;
  int local_1964;
  long *local_1960;
  int local_1954;
  int local_1950;
  int local_194c;
  long *local_1948;
  int local_193c;
  int local_1938;
  int local_1934;
  long *local_1930;
  int local_1924;
  int local_1920;
  int local_191c;
  long *local_1918;
  int local_190c;
  int local_1908;
  int local_1904;
  long *local_1900;
  int local_18f4;
  int local_18f0;
  int local_18ec;
  long *local_18e8;
  int local_18dc;
  int local_18d8;
  int local_18d4;
  long *local_18d0;
  int local_18c4;
  int local_18c0;
  int local_18bc;
  long *local_18b8;
  int local_18ac;
  int local_18a8;
  int local_18a4;
  long *local_18a0;
  int local_1894;
  int local_1890;
  int local_188c;
  long *local_1888;
  int local_187c;
  int local_1878;
  int local_1874;
  long *local_1870;
  int local_1864;
  int local_1860;
  int local_185c;
  long *local_1858;
  int local_184c;
  int local_1848;
  int local_1844;
  long *local_1840;
  int local_1834;
  int local_1830;
  int local_182c;
  long *local_1828;
  int local_181c;
  int local_1818;
  int local_1814;
  long *local_1810;
  int local_1804;
  int local_1800;
  int local_17fc;
  long *local_17f8;
  int local_17ec;
  int local_17e8;
  int local_17e4;
  long *local_17e0;
  int local_17d4;
  int local_17d0;
  int local_17cc;
  long *local_17c8;
  int local_17bc;
  int local_17b8;
  int local_17b4;
  long *local_17b0;
  int local_17a4;
  int local_17a0;
  int local_179c;
  long *local_1798;
  int local_178c;
  int local_1788;
  int local_1784;
  long *local_1780;
  int local_1774;
  int local_1770;
  int local_176c;
  long *local_1768;
  int local_175c;
  int local_1758;
  int local_1754;
  long *local_1750;
  int local_1744;
  int local_1740;
  int local_173c;
  long *local_1738;
  int local_172c;
  int local_1728;
  int local_1724;
  long *local_1720;
  int local_1714;
  int local_1710;
  int local_170c;
  long *local_1708;
  int local_16fc;
  int local_16f8;
  int local_16f4;
  long *local_16f0;
  int local_16e4;
  int local_16e0;
  int local_16dc;
  long *local_16d8;
  int local_16cc;
  int local_16c8;
  int local_16c4;
  long *local_16c0;
  int local_16b4;
  int local_16b0;
  int local_16ac;
  long *local_16a8;
  int local_169c;
  int local_1698;
  int local_1694;
  long *local_1690;
  int local_1684;
  int local_1680;
  int local_167c;
  long *local_1678;
  int local_166c;
  int local_1668;
  int local_1664;
  long *local_1660;
  int local_1654;
  int local_1650;
  int local_164c;
  long *local_1648;
  int local_163c;
  int local_1638;
  int local_1634;
  long *local_1630;
  int local_1624;
  int local_1620;
  int local_161c;
  long *local_1618;
  int local_160c;
  int local_1608;
  int local_1604;
  long *local_1600;
  int local_15f4;
  int local_15f0;
  int local_15ec;
  long *local_15e8;
  int local_15dc;
  int local_15d8;
  int local_15d4;
  long *local_15d0;
  int local_15c4;
  int local_15c0;
  int local_15bc;
  long *local_15b8;
  int local_15ac;
  int local_15a8;
  int local_15a4;
  long *local_15a0;
  int local_1594;
  int local_1590;
  int local_158c;
  long *local_1588;
  int local_157c;
  int local_1578;
  int local_1574;
  long *local_1570;
  int local_1564;
  int local_1560;
  int local_155c;
  long *local_1558;
  int local_154c;
  int local_1548;
  int local_1544;
  long *local_1540;
  int local_1534;
  int local_1530;
  int local_152c;
  long *local_1528;
  int local_151c;
  int local_1518;
  int local_1514;
  long *local_1510;
  int local_1504;
  int local_1500;
  int local_14fc;
  long *local_14f8;
  int local_14ec;
  int local_14e8;
  int local_14e4;
  long *local_14e0;
  int local_14d4;
  int local_14d0;
  int local_14cc;
  long *local_14c8;
  int local_14bc;
  int local_14b8;
  int local_14b4;
  long *local_14b0;
  int local_14a4;
  int local_14a0;
  int local_149c;
  long *local_1498;
  int local_148c;
  int local_1488;
  int local_1484;
  long *local_1480;
  int local_1474;
  int local_1470;
  int local_146c;
  long *local_1468;
  int local_145c;
  int local_1458;
  int local_1454;
  long *local_1450;
  int local_1444;
  int local_1440;
  int local_143c;
  long *local_1438;
  int local_142c;
  int local_1428;
  int local_1424;
  long *local_1420;
  int local_1414;
  int local_1410;
  int local_140c;
  long *local_1408;
  int local_13fc;
  int local_13f8;
  int local_13f4;
  long *local_13f0;
  int local_13e4;
  int local_13e0;
  int local_13dc;
  long *local_13d8;
  int local_13cc;
  int local_13c8;
  int local_13c4;
  long *local_13c0;
  int local_13b4;
  int local_13b0;
  int local_13ac;
  long *local_13a8;
  int local_139c;
  int local_1398;
  int local_1394;
  long *local_1390;
  int local_1384;
  int local_1380;
  int local_137c;
  long *local_1378;
  int local_136c;
  int local_1368;
  int local_1364;
  long *local_1360;
  int local_1354;
  int local_1350;
  int local_134c;
  long *local_1348;
  int local_133c;
  int local_1338;
  int local_1334;
  long *local_1330;
  int local_1324;
  int local_1320;
  int local_131c;
  long *local_1318;
  int local_130c;
  int local_1308;
  int local_1304;
  long *local_1300;
  int local_12f4;
  int local_12f0;
  int local_12ec;
  long *local_12e8;
  int local_12dc;
  int local_12d8;
  int local_12d4;
  long *local_12d0;
  int local_12c4;
  int local_12c0;
  int local_12bc;
  long *local_12b8;
  int local_12ac;
  int local_12a8;
  int local_12a4;
  long *local_12a0;
  int local_1294;
  int local_1290;
  int local_128c;
  long *local_1288;
  int local_127c;
  int local_1278;
  int local_1274;
  long *local_1270;
  int local_1264;
  int local_1260;
  int local_125c;
  long *local_1258;
  int local_124c;
  int local_1248;
  int local_1244;
  long *local_1240;
  int local_1234;
  int local_1230;
  int local_122c;
  long *local_1228;
  int local_121c;
  int local_1218;
  int local_1214;
  long *local_1210;
  int local_1204;
  int local_1200;
  int local_11fc;
  long *local_11f8;
  int local_11ec;
  int local_11e8;
  int local_11e4;
  long *local_11e0;
  int local_11d4;
  int local_11d0;
  int local_11cc;
  long *local_11c8;
  int local_11bc;
  int local_11b8;
  int local_11b4;
  long *local_11b0;
  int local_11a4;
  int local_11a0;
  int local_119c;
  long *local_1198;
  int local_118c;
  int local_1188;
  int local_1184;
  long *local_1180;
  int local_1174;
  int local_1170;
  int local_116c;
  long *local_1168;
  int local_115c;
  int local_1158;
  int local_1154;
  long *local_1150;
  int local_1144;
  int local_1140;
  int local_113c;
  long *local_1138;
  int local_112c;
  int local_1128;
  int local_1124;
  long *local_1120;
  int local_1114;
  int local_1110;
  int local_110c;
  long *local_1108;
  int local_10fc;
  int local_10f8;
  int local_10f4;
  long *local_10f0;
  int local_10e4;
  int local_10e0;
  int local_10dc;
  long *local_10d8;
  int local_10cc;
  int local_10c8;
  int local_10c4;
  long *local_10c0;
  int local_10b4;
  int local_10b0;
  int local_10ac;
  long *local_10a8;
  int local_109c;
  int local_1098;
  int local_1094;
  long *local_1090;
  int local_1084;
  int local_1080;
  int local_107c;
  long *local_1078;
  int local_106c;
  int local_1068;
  int local_1064;
  long *local_1060;
  int local_1054;
  int local_1050;
  int local_104c;
  long *local_1048;
  int local_103c;
  int local_1038;
  int local_1034;
  long *local_1030;
  int local_1024;
  int local_1020;
  int local_101c;
  long *local_1018;
  int local_100c;
  int local_1008;
  int local_1004;
  long *local_1000;
  int local_ff4;
  int local_ff0;
  int local_fec;
  long *local_fe8;
  int local_fdc;
  int local_fd8;
  int local_fd4;
  long *local_fd0;
  int local_fc4;
  int local_fc0;
  int local_fbc;
  long *local_fb8;
  int local_fac;
  int local_fa8;
  int local_fa4;
  long *local_fa0;
  int local_f94;
  int local_f90;
  int local_f8c;
  long *local_f88;
  int local_f7c;
  int local_f78;
  int local_f74;
  long *local_f70;
  int local_f64;
  int local_f60;
  int local_f5c;
  long *local_f58;
  int local_f4c;
  int local_f48;
  int local_f44;
  long *local_f40;
  int local_f34;
  int local_f30;
  int local_f2c;
  long *local_f28;
  int local_f1c;
  int local_f18;
  int local_f14;
  long *local_f10;
  int local_f04;
  int local_f00;
  int local_efc;
  long *local_ef8;
  int local_eec;
  int local_ee8;
  int local_ee4;
  long *local_ee0;
  int local_ed4;
  int local_ed0;
  int local_ecc;
  long *local_ec8;
  int local_ebc;
  int local_eb8;
  int local_eb4;
  long *local_eb0;
  int local_ea4;
  int local_ea0;
  int local_e9c;
  long *local_e98;
  int local_e8c;
  int local_e88;
  int local_e84;
  long *local_e80;
  int local_e74;
  int local_e70;
  int local_e6c;
  long *local_e68;
  int local_e5c;
  int local_e58;
  int local_e54;
  long *local_e50;
  int local_e44;
  int local_e40;
  int local_e3c;
  long *local_e38;
  int local_e2c;
  int local_e28;
  int local_e24;
  long *local_e20;
  int local_e14;
  int local_e10;
  int local_e0c;
  long *local_e08;
  int local_dfc;
  int local_df8;
  int local_df4;
  long *local_df0;
  int local_de4;
  int local_de0;
  int local_ddc;
  long *local_dd8;
  int local_dcc;
  int local_dc8;
  int local_dc4;
  long *local_dc0;
  int local_db4;
  int local_db0;
  int local_dac;
  long *local_da8;
  int local_d9c;
  int local_d98;
  int local_d94;
  long *local_d90;
  int local_d84;
  int local_d80;
  int local_d7c;
  long *local_d78;
  int local_d6c;
  int local_d68;
  int local_d64;
  long *local_d60;
  int local_d54;
  int local_d50;
  int local_d4c;
  long *local_d48;
  undefined4 local_d3c;
  IntVect *local_d38;
  undefined4 local_d2c;
  IntVect *local_d28;
  undefined4 local_d1c;
  IntVect *local_d18;
  undefined4 local_d0c;
  IntVect *local_d08;
  undefined4 local_cfc;
  IntVect *local_cf8;
  undefined4 local_cec;
  IntVect *local_ce8;
  undefined4 local_cdc;
  Box *local_cd8;
  undefined4 local_ccc;
  Box *local_cc8;
  undefined4 local_cbc;
  Box *local_cb8;
  undefined4 local_cac;
  Box *local_ca8;
  undefined4 local_c9c;
  Box *local_c98;
  undefined4 local_c8c;
  Box *local_c88;
  undefined4 local_c7c;
  byte *local_c78;
  undefined4 local_c6c;
  byte *local_c68;
  undefined4 local_c5c;
  byte *local_c58;
  undefined4 local_c4c;
  byte *local_c48;
  undefined4 local_c3c;
  byte *local_c38;
  undefined4 local_c2c;
  byte *local_c28;
  undefined4 local_c1c;
  byte *local_c18;
  undefined4 local_c0c;
  byte *local_c08;
  undefined4 local_bfc;
  byte *local_bf8;
  undefined4 local_bec;
  byte *local_be8;
  undefined4 local_bdc;
  byte *local_bd8;
  undefined4 local_bcc;
  byte *local_bc8;
  undefined4 local_bbc;
  byte *local_bb8;
  undefined4 local_bac;
  byte *local_ba8;
  undefined4 local_b9c;
  byte *local_b98;
  undefined4 local_b8c;
  byte *local_b88;
  undefined4 local_b7c;
  byte *local_b78;
  undefined4 local_b6c;
  byte *local_b68;
  undefined4 local_b5c;
  byte *local_b58;
  undefined4 local_b4c;
  byte *local_b48;
  undefined4 local_b3c;
  byte *local_b38;
  undefined4 local_b2c;
  byte *local_b28;
  undefined4 local_b1c;
  byte *local_b18;
  undefined4 local_b0c;
  byte *local_b08;
  undefined4 local_afc;
  byte *local_af8;
  undefined4 local_aec;
  byte *local_ae8;
  undefined4 local_adc;
  byte *local_ad8;
  undefined4 local_acc;
  byte *local_ac8;
  undefined4 local_abc;
  byte *local_ab8;
  undefined4 local_aac;
  byte *local_aa8;
  undefined4 local_a9c;
  byte *local_a98;
  undefined4 local_a8c;
  byte *local_a88;
  undefined4 local_a7c;
  byte *local_a78;
  undefined4 local_a6c;
  byte *local_a68;
  undefined4 local_a5c;
  byte *local_a58;
  undefined4 local_a4c;
  byte *local_a48;
  undefined4 local_a3c;
  byte *local_a38;
  undefined4 local_a2c;
  byte *local_a28;
  undefined4 local_a1c;
  byte *local_a18;
  undefined4 local_a0c;
  byte *local_a08;
  undefined4 local_9fc;
  byte *local_9f8;
  undefined4 local_9ec;
  byte *local_9e8;
  undefined4 local_9dc;
  byte *local_9d8;
  undefined4 local_9cc;
  byte *local_9c8;
  undefined4 local_9bc;
  byte *local_9b8;
  undefined4 local_9ac;
  byte *local_9a8;
  undefined4 local_99c;
  byte *local_998;
  undefined4 local_98c;
  byte *local_988;
  undefined4 local_97c;
  byte *local_978;
  undefined4 local_96c;
  byte *local_968;
  undefined4 local_95c;
  byte *local_958;
  undefined4 local_94c;
  byte *local_948;
  undefined4 local_93c;
  byte *local_938;
  undefined4 local_92c;
  byte *local_928;
  undefined4 local_91c;
  byte *local_918;
  undefined4 local_90c;
  byte *local_908;
  undefined4 local_8fc;
  byte *local_8f8;
  undefined4 local_8ec;
  byte *local_8e8;
  undefined4 local_8dc;
  byte *local_8d8;
  undefined4 local_8cc;
  byte *local_8c8;
  undefined4 local_8bc;
  byte *local_8b8;
  undefined4 local_8ac;
  byte *local_8a8;
  undefined4 local_89c;
  byte *local_898;
  undefined4 local_88c;
  byte *local_888;
  undefined4 local_87c;
  byte *local_878;
  undefined4 local_86c;
  byte *local_868;
  undefined4 local_85c;
  byte *local_858;
  undefined4 local_84c;
  byte *local_848;
  undefined4 local_83c;
  byte *local_838;
  undefined4 local_82c;
  byte *local_828;
  undefined4 local_81c;
  byte *local_818;
  undefined4 local_80c;
  byte *local_808;
  undefined4 local_7fc;
  byte *local_7f8;
  undefined4 local_7ec;
  byte *local_7e8;
  undefined4 local_7dc;
  byte *local_7d8;
  undefined4 local_7cc;
  byte *local_7c8;
  undefined4 local_7bc;
  byte *local_7b8;
  undefined4 local_7ac;
  byte *local_7a8;
  undefined4 local_79c;
  byte *local_798;
  undefined4 local_78c;
  byte *local_788;
  undefined4 local_77c;
  byte *local_778;
  undefined4 local_76c;
  byte *local_768;
  undefined4 local_75c;
  byte *local_758;
  undefined4 local_74c;
  byte *local_748;
  undefined4 local_73c;
  byte *local_738;
  undefined4 local_72c;
  byte *local_728;
  undefined4 local_71c;
  byte *local_718;
  undefined4 local_70c;
  byte *local_708;
  undefined4 local_6fc;
  byte *local_6f8;
  undefined4 local_6ec;
  byte *local_6e8;
  undefined4 local_6dc;
  byte *local_6d8;
  undefined4 local_6cc;
  byte *local_6c8;
  undefined4 local_6bc;
  byte *local_6b8;
  undefined4 local_6ac;
  byte *local_6a8;
  undefined4 local_69c;
  byte *local_698;
  undefined4 local_68c;
  byte *local_688;
  undefined4 local_67c;
  byte *local_678;
  undefined4 local_66c;
  byte *local_668;
  undefined4 local_65c;
  byte *local_658;
  undefined4 local_64c;
  byte *local_648;
  undefined4 local_63c;
  byte *local_638;
  undefined4 local_62c;
  byte *local_628;
  undefined4 local_61c;
  byte *local_618;
  undefined4 local_60c;
  byte *local_608;
  undefined4 local_5fc;
  byte *local_5f8;
  undefined4 local_5ec;
  byte *local_5e8;
  undefined4 local_5dc;
  byte *local_5d8;
  undefined4 local_5cc;
  byte *local_5c8;
  undefined4 local_5bc;
  byte *local_5b8;
  undefined4 local_5ac;
  byte *local_5a8;
  undefined4 local_59c;
  byte *local_598;
  undefined4 local_58c;
  byte *local_588;
  undefined4 local_57c;
  byte *local_578;
  undefined4 local_56c;
  byte *local_568;
  undefined4 local_55c;
  byte *local_558;
  undefined4 local_54c;
  byte *local_548;
  undefined4 local_53c;
  byte *local_538;
  undefined4 local_52c;
  byte *local_528;
  undefined4 local_51c;
  byte *local_518;
  undefined4 local_50c;
  byte *local_508;
  undefined4 local_4fc;
  byte *local_4f8;
  undefined4 local_4ec;
  byte *local_4e8;
  undefined4 local_4dc;
  byte *local_4d8;
  undefined4 local_4cc;
  byte *local_4c8;
  undefined4 local_4bc;
  byte *local_4b8;
  undefined4 local_4ac;
  byte *local_4a8;
  undefined4 local_49c;
  byte *local_498;
  undefined4 local_48c;
  byte *local_488;
  undefined4 local_47c;
  byte *local_478;
  undefined4 local_46c;
  byte *local_468;
  undefined4 local_45c;
  byte *local_458;
  undefined4 local_44c;
  byte *local_448;
  undefined4 local_43c;
  byte *local_438;
  undefined4 local_42c;
  byte *local_428;
  undefined4 local_41c;
  byte *local_418;
  undefined4 local_40c;
  byte *local_408;
  undefined4 local_3fc;
  byte *local_3f8;
  undefined4 local_3ec;
  byte *local_3e8;
  undefined4 local_3dc;
  byte *local_3d8;
  undefined4 local_3cc;
  byte *local_3c8;
  undefined4 local_3bc;
  byte *local_3b8;
  undefined4 local_3ac;
  byte *local_3a8;
  undefined4 local_39c;
  byte *local_398;
  undefined4 local_38c;
  byte *local_388;
  undefined4 local_37c;
  byte *local_378;
  undefined4 local_36c;
  byte *local_368;
  undefined4 local_35c;
  byte *local_358;
  undefined4 local_34c;
  byte *local_348;
  undefined4 local_33c;
  byte *local_338;
  undefined4 local_32c;
  byte *local_328;
  undefined4 local_31c;
  byte *local_318;
  undefined4 local_30c;
  byte *local_308;
  undefined4 local_2fc;
  byte *local_2f8;
  undefined4 local_2ec;
  byte *local_2e8;
  undefined4 local_2dc;
  byte *local_2d8;
  undefined4 local_2cc;
  byte *local_2c8;
  undefined4 local_2bc;
  byte *local_2b8;
  undefined4 local_2ac;
  byte *local_2a8;
  undefined4 local_29c;
  byte *local_298;
  undefined4 local_28c;
  byte *local_288;
  undefined4 local_27c;
  byte *local_278;
  undefined4 local_26c;
  byte *local_268;
  undefined4 local_25c;
  byte *local_258;
  undefined4 local_24c;
  byte *local_248;
  undefined4 local_23c;
  byte *local_238;
  undefined4 local_22c;
  byte *local_228;
  undefined4 local_21c;
  byte *local_218;
  undefined4 local_20c;
  byte *local_208;
  undefined4 local_1fc;
  byte *local_1f8;
  undefined4 local_1ec;
  byte *local_1e8;
  undefined4 local_1dc;
  byte *local_1d8;
  undefined4 local_1cc;
  byte *local_1c8;
  undefined4 local_1bc;
  byte *local_1b8;
  undefined4 local_1ac;
  byte *local_1a8;
  undefined4 local_19c;
  byte *local_198;
  undefined4 local_18c;
  byte *local_188;
  undefined4 local_17c;
  byte *local_178;
  undefined4 local_16c;
  byte *local_168;
  undefined4 local_15c;
  byte *local_158;
  undefined4 local_14c;
  byte *local_148;
  undefined4 local_13c;
  byte *local_138;
  undefined4 local_12c;
  byte *local_128;
  undefined4 local_11c;
  byte *local_118;
  undefined4 local_10c;
  byte *local_108;
  undefined4 local_fc;
  byte *local_f8;
  undefined4 local_ec;
  byte *local_e8;
  undefined4 local_dc;
  byte *local_d8;
  undefined4 local_cc;
  byte *local_c8;
  undefined4 local_bc;
  byte *local_b8;
  undefined4 local_ac;
  byte *local_a8;
  undefined4 local_9c;
  byte *local_98;
  undefined4 local_8c;
  byte *local_88;
  undefined4 local_7c;
  byte *local_78;
  undefined4 local_6c;
  byte *local_68;
  undefined4 local_5c;
  byte *local_58;
  undefined4 local_4c;
  byte *local_48;
  undefined4 local_3c;
  byte *local_38;
  undefined4 local_2c;
  byte *local_28;
  int local_1c;
  byte *local_18;
  int local_c;
  byte *local_8;
  
  local_208c.smallend.vect._0_8_ = *(undefined8 *)(in_RDX->smallend).vect;
  local_208c._8_8_ = *(undefined8 *)((in_RDX->smallend).vect + 2);
  local_208c.bigend.vect._4_8_ = *(undefined8 *)((in_RDX->bigend).vect + 1);
  local_208c.btype.itype = (in_RDX->btype).itype;
  local_2070 = in_R8;
  local_2068 = in_RCX;
  local_2060 = in_RDX;
  local_2058 = in_RSI;
  local_2050 = in_RDI;
  for (local_2090 = 0; local_2090 < 3; local_2090 = local_2090 + 1) {
    local_8 = local_2068;
    local_c = local_2090;
    if ((local_2068[local_2090] & 1) == 0) {
      Box::growLo(&local_208c,local_2090,1);
    }
    local_18 = local_2070;
    local_1c = local_2090;
    if ((local_2070[local_2090] & 1) == 0) {
      Box::growHi(&local_208c,local_2090,1);
    }
  }
  bVar2 = Box::strictly_contains(&local_208c,local_2050);
  if (!bVar2) {
    bVar2 = Box::cellCentered(local_2060);
    local_2094 = (uint)!bVar2;
    local_2010 = local_2060;
    local_cb8 = local_2060;
    local_cbc = 0;
    local_2004 = (local_2060->smallend).vect[0];
    local_cc8 = local_2060;
    local_ccc = 1;
    iStack_2000 = (local_2060->smallend).vect[1];
    local_20b0 = *(undefined8 *)(local_2060->smallend).vect;
    local_cd8 = local_2060;
    local_cdc = 2;
    local_20a8 = (local_2060->smallend).vect[2];
    local_1fc0 = local_2060;
    local_d18 = &local_2060->bigend;
    local_d1c = 0;
    local_1fb8 = local_d18->vect[0];
    local_d28 = &local_2060->bigend;
    local_d2c = 1;
    iStack_1fb4 = (local_2060->bigend).vect[1];
    local_20d0 = *(undefined8 *)local_d18->vect;
    local_d38 = &local_2060->bigend;
    local_d3c = 2;
    local_20c8 = (local_2060->bigend).vect[2];
    local_1fa8 = local_2050;
    local_1fac = 1;
    local_20f8.smallend.vect._0_8_ = *(undefined8 *)(local_2050->smallend).vect;
    uVar1 = *(undefined8 *)((local_2050->smallend).vect + 2);
    local_20f8._20_8_ = *(undefined8 *)((local_2050->bigend).vect + 2);
    local_20f8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(local_2050->bigend).vect >> 0x20);
    local_20f8.smallend.vect[2] = (int)uVar1;
    local_20f8.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
    local_20c0 = local_20d0;
    local_20b8 = local_20c8;
    local_20a0 = local_20b0;
    local_2098 = local_20a8;
    local_2020 = local_20b0;
    local_2018 = local_20a8;
    local_1ffc = local_20a8;
    local_1fd0 = local_20d0;
    local_1fc8 = local_20c8;
    local_1fb0 = local_20c8;
    Box::grow(&local_20f8,1);
    local_c8c = 0;
    local_202c = local_20f8.smallend.vect[0];
    local_c9c = 1;
    iStack_2028 = local_20f8.smallend.vect[1];
    local_2118[0] = local_20f8.smallend.vect[0];
    local_2118[1] = local_20f8.smallend.vect[1];
    local_cac = 2;
    local_ce8 = &local_20f8.bigend;
    local_cec = 0;
    local_1fdc = local_20f8.bigend.vect[0];
    local_cf8 = &local_20f8.bigend;
    local_cfc = 1;
    iStack_1fd8 = local_20f8.bigend.vect[1];
    local_2138 = CONCAT44(local_20f8.bigend.vect[1],local_20f8.bigend.vect[0]);
    local_d08 = &local_20f8.bigend;
    local_d0c = 2;
    local_2130 = local_20f8.bigend.vect[2];
    local_213c = local_20f8.smallend.vect[2];
    local_2124 = local_2138;
    local_211c = local_2130;
    local_2110 = local_213c;
    _local_2108 = local_2118;
    local_2100 = local_213c;
    local_20d8 = &local_20f8;
    local_2048 = local_2118;
    local_2040 = local_213c;
    local_2038 = &local_20f8;
    local_2024 = local_213c;
    local_1ff8 = local_2138;
    local_1ff0 = local_2130;
    local_1fe8 = &local_20f8;
    local_1fd4 = local_2130;
    local_ca8 = &local_20f8;
    local_c98 = &local_20f8;
    local_c88 = &local_20f8;
    for (; local_213c <= local_211c; local_213c = local_213c + 1) {
      for (local_2140 = iStack_2104; local_2140 <= local_2124._4_4_; local_2140 = local_2140 + 1) {
        for (local_2144 = local_2108; local_2144 <= (int)local_2124; local_2144 = local_2144 + 1) {
          IntVect::IntVect(&local_2150,local_2144,local_2140,local_213c);
          bVar2 = Box::contains(&local_208c,&local_2150);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            if (((local_2144 == (int)local_20a0 + -1) && (local_2140 == local_20a0._4_4_ + -1)) &&
               (local_213c == local_2098 + -1)) {
              local_28 = local_2068;
              local_2c = 0;
              if ((*local_2068 & 1) == 0) {
                local_38 = local_2068;
                local_3c = 1;
                if ((local_2068[1] & 1) == 0) {
                  local_48 = local_2068;
                  local_4c = 2;
                  if ((local_2068[2] & 1) == 0) goto LAB_01691faa;
                }
              }
              local_58 = local_2068;
              local_5c = 0;
              if ((*local_2068 & 1) != 0) {
                local_68 = local_2068;
                local_6c = 1;
                if ((local_2068[1] & 1) != 0) {
                  local_78 = local_2068;
                  local_7c = 2;
                  if ((local_2068[2] & 1) != 0) {
                    local_d4c = local_2144 + 1 + local_2094;
                    local_d50 = local_2140 + 1 + local_2094;
                    local_d54 = local_213c + 1 + local_2094;
                    local_d48 = local_2058;
                    local_d60 = local_2058;
                    local_d64 = local_2144;
                    local_d68 = local_2140;
                    local_d6c = local_213c;
                    *(undefined4 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                         *(undefined4 *)
                          (*local_2058 +
                          ((long)(local_d4c - (int)local_2058[4]) +
                           (long)(local_d50 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_d54 - (int)local_2058[5]) * local_2058[2]) * 4);
                    goto LAB_0169a549;
                  }
                }
              }
              local_88 = local_2068;
              local_8c = 0;
              if ((*local_2068 & 1) != 0) {
                local_98 = local_2068;
                local_9c = 1;
                if ((local_2068[1] & 1) != 0) {
                  local_d7c = local_2144 + 1 + local_2094;
                  local_d80 = local_2140 + 1 + local_2094;
                  local_d78 = local_2058;
                  local_d84 = local_213c;
                  local_d90 = local_2058;
                  local_d94 = local_2144;
                  local_d98 = local_2140;
                  local_d9c = local_213c;
                  *(undefined4 *)
                   (*local_2058 +
                   ((long)(local_2144 - (int)local_2058[4]) +
                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                       *(undefined4 *)
                        (*local_2058 +
                        ((long)(local_d7c - (int)local_2058[4]) +
                         (long)(local_d80 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                  goto LAB_0169a549;
                }
              }
              local_a8 = local_2068;
              local_ac = 0;
              if ((*local_2068 & 1) != 0) {
                local_b8 = local_2068;
                local_bc = 2;
                if ((local_2068[2] & 1) != 0) {
                  local_dac = local_2144 + 1 + local_2094;
                  local_db4 = local_213c + 1 + local_2094;
                  local_da8 = local_2058;
                  local_db0 = local_2140;
                  local_dc0 = local_2058;
                  local_dc4 = local_2144;
                  local_dc8 = local_2140;
                  local_dcc = local_213c;
                  *(undefined4 *)
                   (*local_2058 +
                   ((long)(local_2144 - (int)local_2058[4]) +
                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                       *(undefined4 *)
                        (*local_2058 +
                        ((long)(local_dac - (int)local_2058[4]) +
                         (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                        (long)(local_db4 - (int)local_2058[5]) * local_2058[2]) * 4);
                  goto LAB_0169a549;
                }
              }
              local_c8 = local_2068;
              local_cc = 1;
              if ((local_2068[1] & 1) != 0) {
                local_d8 = local_2068;
                local_dc = 2;
                if ((local_2068[2] & 1) != 0) {
                  local_de0 = local_2140 + 1 + local_2094;
                  local_de4 = local_213c + 1 + local_2094;
                  local_dd8 = local_2058;
                  local_ddc = local_2144;
                  local_df0 = local_2058;
                  local_df4 = local_2144;
                  local_df8 = local_2140;
                  local_dfc = local_213c;
                  *(undefined4 *)
                   (*local_2058 +
                   ((long)(local_2144 - (int)local_2058[4]) +
                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                       *(undefined4 *)
                        (*local_2058 +
                        ((long)(local_2144 - (int)local_2058[4]) +
                         (long)(local_de0 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                        (long)(local_de4 - (int)local_2058[5]) * local_2058[2]) * 4);
                  goto LAB_0169a549;
                }
              }
              local_e8 = local_2068;
              local_ec = 0;
              if ((*local_2068 & 1) == 0) {
                local_f8 = local_2068;
                local_fc = 1;
                if ((local_2068[1] & 1) == 0) {
                  local_108 = local_2068;
                  local_10c = 2;
                  if ((local_2068[2] & 1) != 0) {
                    local_e74 = local_213c + 1 + local_2094;
                    local_e68 = local_2058;
                    local_e6c = local_2144;
                    local_e70 = local_2140;
                    local_e80 = local_2058;
                    local_e84 = local_2144;
                    local_e88 = local_2140;
                    local_e8c = local_213c;
                    *(undefined4 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                         *(undefined4 *)
                          (*local_2058 +
                          ((long)(local_2144 - (int)local_2058[4]) +
                           (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_e74 - (int)local_2058[5]) * local_2058[2]) * 4);
                  }
                }
                else {
                  local_e40 = local_2140 + 1 + local_2094;
                  local_e38 = local_2058;
                  local_e3c = local_2144;
                  local_e44 = local_213c;
                  local_e50 = local_2058;
                  local_e54 = local_2144;
                  local_e58 = local_2140;
                  local_e5c = local_213c;
                  *(undefined4 *)
                   (*local_2058 +
                   ((long)(local_2144 - (int)local_2058[4]) +
                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                       *(undefined4 *)
                        (*local_2058 +
                        ((long)(local_2144 - (int)local_2058[4]) +
                         (long)(local_e40 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                }
              }
              else {
                local_e0c = local_2144 + 1 + local_2094;
                local_e08 = local_2058;
                local_e10 = local_2140;
                local_e14 = local_213c;
                local_e20 = local_2058;
                local_e24 = local_2144;
                local_e28 = local_2140;
                local_e2c = local_213c;
                *(undefined4 *)
                 (*local_2058 +
                 ((long)(local_2144 - (int)local_2058[4]) +
                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                     *(undefined4 *)
                      (*local_2058 +
                      ((long)(local_e0c - (int)local_2058[4]) +
                       (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                      (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
              }
            }
            else {
LAB_01691faa:
              if (((local_2144 == (int)local_20c0 + 1) && (local_2140 == local_20a0._4_4_ + -1)) &&
                 (local_213c == local_2098 + -1)) {
                local_118 = local_2070;
                local_11c = 0;
                if ((*local_2070 & 1) == 0) {
                  local_128 = local_2068;
                  local_12c = 1;
                  if ((local_2068[1] & 1) == 0) {
                    local_138 = local_2068;
                    local_13c = 2;
                    if ((local_2068[2] & 1) == 0) goto LAB_01692a1a;
                  }
                }
                local_148 = local_2070;
                local_14c = 0;
                if ((*local_2070 & 1) != 0) {
                  local_158 = local_2068;
                  local_15c = 1;
                  if ((local_2068[1] & 1) != 0) {
                    local_168 = local_2068;
                    local_16c = 2;
                    if ((local_2068[2] & 1) != 0) {
                      local_e9c = (local_2144 + -1) - local_2094;
                      local_ea0 = local_2140 + 1 + local_2094;
                      local_ea4 = local_213c + 1 + local_2094;
                      local_e98 = local_2058;
                      local_eb0 = local_2058;
                      local_eb4 = local_2144;
                      local_eb8 = local_2140;
                      local_ebc = local_213c;
                      *(undefined4 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                           *(undefined4 *)
                            (*local_2058 +
                            ((long)(local_e9c - (int)local_2058[4]) +
                             (long)(local_ea0 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                            (long)(local_ea4 - (int)local_2058[5]) * local_2058[2]) * 4);
                      goto LAB_0169a549;
                    }
                  }
                }
                local_178 = local_2070;
                local_17c = 0;
                if ((*local_2070 & 1) != 0) {
                  local_188 = local_2068;
                  local_18c = 1;
                  if ((local_2068[1] & 1) != 0) {
                    local_ecc = (local_2144 + -1) - local_2094;
                    local_ed0 = local_2140 + 1 + local_2094;
                    local_ec8 = local_2058;
                    local_ed4 = local_213c;
                    local_ee0 = local_2058;
                    local_ee4 = local_2144;
                    local_ee8 = local_2140;
                    local_eec = local_213c;
                    *(undefined4 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                         *(undefined4 *)
                          (*local_2058 +
                          ((long)(local_ecc - (int)local_2058[4]) +
                           (long)(local_ed0 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                    goto LAB_0169a549;
                  }
                }
                local_198 = local_2070;
                local_19c = 0;
                if ((*local_2070 & 1) != 0) {
                  local_1a8 = local_2068;
                  local_1ac = 2;
                  if ((local_2068[2] & 1) != 0) {
                    local_efc = (local_2144 + -1) - local_2094;
                    local_f04 = local_213c + 1 + local_2094;
                    local_ef8 = local_2058;
                    local_f00 = local_2140;
                    local_f10 = local_2058;
                    local_f14 = local_2144;
                    local_f18 = local_2140;
                    local_f1c = local_213c;
                    *(undefined4 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                         *(undefined4 *)
                          (*local_2058 +
                          ((long)(local_efc - (int)local_2058[4]) +
                           (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_f04 - (int)local_2058[5]) * local_2058[2]) * 4);
                    goto LAB_0169a549;
                  }
                }
                local_1b8 = local_2068;
                local_1bc = 1;
                if ((local_2068[1] & 1) != 0) {
                  local_1c8 = local_2068;
                  local_1cc = 2;
                  if ((local_2068[2] & 1) != 0) {
                    local_f30 = local_2140 + 1 + local_2094;
                    local_f34 = local_213c + 1 + local_2094;
                    local_f28 = local_2058;
                    local_f2c = local_2144;
                    local_f40 = local_2058;
                    local_f44 = local_2144;
                    local_f48 = local_2140;
                    local_f4c = local_213c;
                    *(undefined4 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                         *(undefined4 *)
                          (*local_2058 +
                          ((long)(local_2144 - (int)local_2058[4]) +
                           (long)(local_f30 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_f34 - (int)local_2058[5]) * local_2058[2]) * 4);
                    goto LAB_0169a549;
                  }
                }
                local_1d8 = local_2070;
                local_1dc = 0;
                if ((*local_2070 & 1) == 0) {
                  local_1e8 = local_2068;
                  local_1ec = 1;
                  if ((local_2068[1] & 1) == 0) {
                    local_1f8 = local_2068;
                    local_1fc = 2;
                    if ((local_2068[2] & 1) != 0) {
                      local_fc4 = local_213c + 1 + local_2094;
                      local_fb8 = local_2058;
                      local_fbc = local_2144;
                      local_fc0 = local_2140;
                      local_fd0 = local_2058;
                      local_fd4 = local_2144;
                      local_fd8 = local_2140;
                      local_fdc = local_213c;
                      *(undefined4 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                           *(undefined4 *)
                            (*local_2058 +
                            ((long)(local_2144 - (int)local_2058[4]) +
                             (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_fc4 - (int)local_2058[5]) * local_2058[2]) * 4);
                    }
                  }
                  else {
                    local_f90 = local_2140 + 1 + local_2094;
                    local_f88 = local_2058;
                    local_f8c = local_2144;
                    local_f94 = local_213c;
                    local_fa0 = local_2058;
                    local_fa4 = local_2144;
                    local_fa8 = local_2140;
                    local_fac = local_213c;
                    *(undefined4 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                         *(undefined4 *)
                          (*local_2058 +
                          ((long)(local_2144 - (int)local_2058[4]) +
                           (long)(local_f90 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                  }
                }
                else {
                  local_f5c = (local_2144 + -1) - local_2094;
                  local_f58 = local_2058;
                  local_f60 = local_2140;
                  local_f64 = local_213c;
                  local_f70 = local_2058;
                  local_f74 = local_2144;
                  local_f78 = local_2140;
                  local_f7c = local_213c;
                  *(undefined4 *)
                   (*local_2058 +
                   ((long)(local_2144 - (int)local_2058[4]) +
                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                       *(undefined4 *)
                        (*local_2058 +
                        ((long)(local_f5c - (int)local_2058[4]) +
                         (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                }
              }
              else {
LAB_01692a1a:
                if (((local_2144 == (int)local_20a0 + -1) && (local_2140 == local_20c0._4_4_ + 1))
                   && (local_213c == local_2098 + -1)) {
                  local_208 = local_2068;
                  local_20c = 0;
                  if ((*local_2068 & 1) == 0) {
                    local_218 = local_2070;
                    local_21c = 1;
                    if ((local_2070[1] & 1) == 0) {
                      local_228 = local_2068;
                      local_22c = 2;
                      if ((local_2068[2] & 1) == 0) goto LAB_0169348a;
                    }
                  }
                  local_238 = local_2068;
                  local_23c = 0;
                  if ((*local_2068 & 1) != 0) {
                    local_248 = local_2070;
                    local_24c = 1;
                    if ((local_2070[1] & 1) != 0) {
                      local_258 = local_2068;
                      local_25c = 2;
                      if ((local_2068[2] & 1) != 0) {
                        local_fec = local_2144 + 1 + local_2094;
                        local_ff0 = (local_2140 + -1) - local_2094;
                        local_ff4 = local_213c + 1 + local_2094;
                        local_fe8 = local_2058;
                        local_1000 = local_2058;
                        local_1004 = local_2144;
                        local_1008 = local_2140;
                        local_100c = local_213c;
                        *(undefined4 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                             *(undefined4 *)
                              (*local_2058 +
                              ((long)(local_fec - (int)local_2058[4]) +
                               (long)(local_ff0 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                              + (long)(local_ff4 - (int)local_2058[5]) * local_2058[2]) * 4);
                        goto LAB_0169a549;
                      }
                    }
                  }
                  local_268 = local_2068;
                  local_26c = 0;
                  if ((*local_2068 & 1) != 0) {
                    local_278 = local_2070;
                    local_27c = 1;
                    if ((local_2070[1] & 1) != 0) {
                      local_101c = local_2144 + 1 + local_2094;
                      local_1020 = (local_2140 + -1) - local_2094;
                      local_1018 = local_2058;
                      local_1024 = local_213c;
                      local_1030 = local_2058;
                      local_1034 = local_2144;
                      local_1038 = local_2140;
                      local_103c = local_213c;
                      *(undefined4 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                           *(undefined4 *)
                            (*local_2058 +
                            ((long)(local_101c - (int)local_2058[4]) +
                             (long)(local_1020 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                      goto LAB_0169a549;
                    }
                  }
                  local_288 = local_2068;
                  local_28c = 0;
                  if ((*local_2068 & 1) != 0) {
                    local_298 = local_2068;
                    local_29c = 2;
                    if ((local_2068[2] & 1) != 0) {
                      local_104c = local_2144 + 1 + local_2094;
                      local_1054 = local_213c + 1 + local_2094;
                      local_1048 = local_2058;
                      local_1050 = local_2140;
                      local_1060 = local_2058;
                      local_1064 = local_2144;
                      local_1068 = local_2140;
                      local_106c = local_213c;
                      *(undefined4 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                           *(undefined4 *)
                            (*local_2058 +
                            ((long)(local_104c - (int)local_2058[4]) +
                             (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_1054 - (int)local_2058[5]) * local_2058[2]) * 4);
                      goto LAB_0169a549;
                    }
                  }
                  local_2a8 = local_2070;
                  local_2ac = 1;
                  if ((local_2070[1] & 1) != 0) {
                    local_2b8 = local_2068;
                    local_2bc = 2;
                    if ((local_2068[2] & 1) != 0) {
                      local_1080 = (local_2140 + -1) - local_2094;
                      local_1084 = local_213c + 1 + local_2094;
                      local_1078 = local_2058;
                      local_107c = local_2144;
                      local_1090 = local_2058;
                      local_1094 = local_2144;
                      local_1098 = local_2140;
                      local_109c = local_213c;
                      *(undefined4 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                           *(undefined4 *)
                            (*local_2058 +
                            ((long)(local_2144 - (int)local_2058[4]) +
                             (long)(local_1080 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_1084 - (int)local_2058[5]) * local_2058[2]) * 4);
                      goto LAB_0169a549;
                    }
                  }
                  local_2c8 = local_2068;
                  local_2cc = 0;
                  if ((*local_2068 & 1) == 0) {
                    local_2d8 = local_2070;
                    local_2dc = 1;
                    if ((local_2070[1] & 1) == 0) {
                      local_2e8 = local_2068;
                      local_2ec = 2;
                      if ((local_2068[2] & 1) != 0) {
                        local_1114 = local_213c + 1 + local_2094;
                        local_1108 = local_2058;
                        local_110c = local_2144;
                        local_1110 = local_2140;
                        local_1120 = local_2058;
                        local_1124 = local_2144;
                        local_1128 = local_2140;
                        local_112c = local_213c;
                        *(undefined4 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                             *(undefined4 *)
                              (*local_2058 +
                              ((long)(local_2144 - (int)local_2058[4]) +
                               (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_1114 - (int)local_2058[5]) * local_2058[2]) * 4);
                      }
                    }
                    else {
                      local_10e0 = (local_2140 + -1) - local_2094;
                      local_10d8 = local_2058;
                      local_10dc = local_2144;
                      local_10e4 = local_213c;
                      local_10f0 = local_2058;
                      local_10f4 = local_2144;
                      local_10f8 = local_2140;
                      local_10fc = local_213c;
                      *(undefined4 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                           *(undefined4 *)
                            (*local_2058 +
                            ((long)(local_2144 - (int)local_2058[4]) +
                             (long)(local_10e0 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                    }
                  }
                  else {
                    local_10ac = local_2144 + 1 + local_2094;
                    local_10a8 = local_2058;
                    local_10b0 = local_2140;
                    local_10b4 = local_213c;
                    local_10c0 = local_2058;
                    local_10c4 = local_2144;
                    local_10c8 = local_2140;
                    local_10cc = local_213c;
                    *(undefined4 *)
                     (*local_2058 +
                     ((long)(local_2144 - (int)local_2058[4]) +
                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                         *(undefined4 *)
                          (*local_2058 +
                          ((long)(local_10ac - (int)local_2058[4]) +
                           (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                  }
                }
                else {
LAB_0169348a:
                  if (((local_2144 == (int)local_20c0 + 1) && (local_2140 == local_20c0._4_4_ + 1))
                     && (local_213c == local_2098 + -1)) {
                    local_2f8 = local_2070;
                    local_2fc = 0;
                    if ((*local_2070 & 1) == 0) {
                      local_308 = local_2070;
                      local_30c = 1;
                      if ((local_2070[1] & 1) == 0) {
                        local_318 = local_2068;
                        local_31c = 2;
                        if ((local_2068[2] & 1) == 0) goto LAB_01693efa;
                      }
                    }
                    local_328 = local_2070;
                    local_32c = 0;
                    if ((*local_2070 & 1) != 0) {
                      local_338 = local_2070;
                      local_33c = 1;
                      if ((local_2070[1] & 1) != 0) {
                        local_348 = local_2068;
                        local_34c = 2;
                        if ((local_2068[2] & 1) != 0) {
                          local_113c = (local_2144 + -1) - local_2094;
                          local_1140 = (local_2140 + -1) - local_2094;
                          local_1144 = local_213c + 1 + local_2094;
                          local_1138 = local_2058;
                          local_1150 = local_2058;
                          local_1154 = local_2144;
                          local_1158 = local_2140;
                          local_115c = local_213c;
                          *(undefined4 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                               *(undefined4 *)
                                (*local_2058 +
                                ((long)(local_113c - (int)local_2058[4]) +
                                 (long)(local_1140 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_1144 - (int)local_2058[5]) * local_2058[2]) * 4);
                          goto LAB_0169a549;
                        }
                      }
                    }
                    local_358 = local_2070;
                    local_35c = 0;
                    if ((*local_2070 & 1) != 0) {
                      local_368 = local_2070;
                      local_36c = 1;
                      if ((local_2070[1] & 1) != 0) {
                        local_116c = (local_2144 + -1) - local_2094;
                        local_1170 = (local_2140 + -1) - local_2094;
                        local_1168 = local_2058;
                        local_1174 = local_213c;
                        local_1180 = local_2058;
                        local_1184 = local_2144;
                        local_1188 = local_2140;
                        local_118c = local_213c;
                        *(undefined4 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                             *(undefined4 *)
                              (*local_2058 +
                              ((long)(local_116c - (int)local_2058[4]) +
                               (long)(local_1170 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                        goto LAB_0169a549;
                      }
                    }
                    local_378 = local_2070;
                    local_37c = 0;
                    if ((*local_2070 & 1) != 0) {
                      local_388 = local_2068;
                      local_38c = 2;
                      if ((local_2068[2] & 1) != 0) {
                        local_119c = (local_2144 + -1) - local_2094;
                        local_11a4 = local_213c + 1 + local_2094;
                        local_1198 = local_2058;
                        local_11a0 = local_2140;
                        local_11b0 = local_2058;
                        local_11b4 = local_2144;
                        local_11b8 = local_2140;
                        local_11bc = local_213c;
                        *(undefined4 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                             *(undefined4 *)
                              (*local_2058 +
                              ((long)(local_119c - (int)local_2058[4]) +
                               (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_11a4 - (int)local_2058[5]) * local_2058[2]) * 4);
                        goto LAB_0169a549;
                      }
                    }
                    local_398 = local_2070;
                    local_39c = 1;
                    if ((local_2070[1] & 1) != 0) {
                      local_3a8 = local_2068;
                      local_3ac = 2;
                      if ((local_2068[2] & 1) != 0) {
                        local_11d0 = (local_2140 + -1) - local_2094;
                        local_11d4 = local_213c + 1 + local_2094;
                        local_11c8 = local_2058;
                        local_11cc = local_2144;
                        local_11e0 = local_2058;
                        local_11e4 = local_2144;
                        local_11e8 = local_2140;
                        local_11ec = local_213c;
                        *(undefined4 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                             *(undefined4 *)
                              (*local_2058 +
                              ((long)(local_2144 - (int)local_2058[4]) +
                               (long)(local_11d0 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_11d4 - (int)local_2058[5]) * local_2058[2]) * 4);
                        goto LAB_0169a549;
                      }
                    }
                    local_3b8 = local_2070;
                    local_3bc = 0;
                    if ((*local_2070 & 1) == 0) {
                      local_3c8 = local_2070;
                      local_3cc = 1;
                      if ((local_2070[1] & 1) == 0) {
                        local_3d8 = local_2068;
                        local_3dc = 2;
                        if ((local_2068[2] & 1) != 0) {
                          local_1264 = local_213c + 1 + local_2094;
                          local_1258 = local_2058;
                          local_125c = local_2144;
                          local_1260 = local_2140;
                          local_1270 = local_2058;
                          local_1274 = local_2144;
                          local_1278 = local_2140;
                          local_127c = local_213c;
                          *(undefined4 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                               *(undefined4 *)
                                (*local_2058 +
                                ((long)(local_2144 - (int)local_2058[4]) +
                                 (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_1264 - (int)local_2058[5]) * local_2058[2]) * 4);
                        }
                      }
                      else {
                        local_1230 = (local_2140 + -1) - local_2094;
                        local_1228 = local_2058;
                        local_122c = local_2144;
                        local_1234 = local_213c;
                        local_1240 = local_2058;
                        local_1244 = local_2144;
                        local_1248 = local_2140;
                        local_124c = local_213c;
                        *(undefined4 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                             *(undefined4 *)
                              (*local_2058 +
                              ((long)(local_2144 - (int)local_2058[4]) +
                               (long)(local_1230 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                      }
                    }
                    else {
                      local_11fc = (local_2144 + -1) - local_2094;
                      local_11f8 = local_2058;
                      local_1200 = local_2140;
                      local_1204 = local_213c;
                      local_1210 = local_2058;
                      local_1214 = local_2144;
                      local_1218 = local_2140;
                      local_121c = local_213c;
                      *(undefined4 *)
                       (*local_2058 +
                       ((long)(local_2144 - (int)local_2058[4]) +
                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                           *(undefined4 *)
                            (*local_2058 +
                            ((long)(local_11fc - (int)local_2058[4]) +
                             (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                            + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                    }
                  }
                  else {
LAB_01693efa:
                    if (((local_2144 == (int)local_20a0 + -1) &&
                        (local_2140 == local_20a0._4_4_ + -1)) && (local_213c == local_20b8 + 1)) {
                      local_3e8 = local_2068;
                      local_3ec = 0;
                      if ((*local_2068 & 1) == 0) {
                        local_3f8 = local_2068;
                        local_3fc = 1;
                        if ((local_2068[1] & 1) == 0) {
                          local_408 = local_2070;
                          local_40c = 2;
                          if ((local_2070[2] & 1) == 0) goto LAB_0169496a;
                        }
                      }
                      local_418 = local_2068;
                      local_41c = 0;
                      if ((*local_2068 & 1) != 0) {
                        local_428 = local_2068;
                        local_42c = 1;
                        if ((local_2068[1] & 1) != 0) {
                          local_438 = local_2070;
                          local_43c = 2;
                          if ((local_2070[2] & 1) != 0) {
                            local_128c = local_2144 + 1 + local_2094;
                            local_1290 = local_2140 + 1 + local_2094;
                            local_1294 = (local_213c + -1) - local_2094;
                            local_1288 = local_2058;
                            local_12a0 = local_2058;
                            local_12a4 = local_2144;
                            local_12a8 = local_2140;
                            local_12ac = local_213c;
                            *(undefined4 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                 *(undefined4 *)
                                  (*local_2058 +
                                  ((long)(local_128c - (int)local_2058[4]) +
                                   (long)(local_1290 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_1294 - (int)local_2058[5]) * local_2058[2]) * 4);
                            goto LAB_0169a549;
                          }
                        }
                      }
                      local_448 = local_2068;
                      local_44c = 0;
                      if ((*local_2068 & 1) != 0) {
                        local_458 = local_2068;
                        local_45c = 1;
                        if ((local_2068[1] & 1) != 0) {
                          local_12bc = local_2144 + 1 + local_2094;
                          local_12c0 = local_2140 + 1 + local_2094;
                          local_12b8 = local_2058;
                          local_12c4 = local_213c;
                          local_12d0 = local_2058;
                          local_12d4 = local_2144;
                          local_12d8 = local_2140;
                          local_12dc = local_213c;
                          *(undefined4 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                               *(undefined4 *)
                                (*local_2058 +
                                ((long)(local_12bc - (int)local_2058[4]) +
                                 (long)(local_12c0 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                          goto LAB_0169a549;
                        }
                      }
                      local_468 = local_2068;
                      local_46c = 0;
                      if ((*local_2068 & 1) != 0) {
                        local_478 = local_2070;
                        local_47c = 2;
                        if ((local_2070[2] & 1) != 0) {
                          local_12ec = local_2144 + 1 + local_2094;
                          local_12f4 = (local_213c + -1) - local_2094;
                          local_12e8 = local_2058;
                          local_12f0 = local_2140;
                          local_1300 = local_2058;
                          local_1304 = local_2144;
                          local_1308 = local_2140;
                          local_130c = local_213c;
                          *(undefined4 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                               *(undefined4 *)
                                (*local_2058 +
                                ((long)(local_12ec - (int)local_2058[4]) +
                                 (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_12f4 - (int)local_2058[5]) * local_2058[2]) * 4);
                          goto LAB_0169a549;
                        }
                      }
                      local_488 = local_2068;
                      local_48c = 1;
                      if ((local_2068[1] & 1) != 0) {
                        local_498 = local_2070;
                        local_49c = 2;
                        if ((local_2070[2] & 1) != 0) {
                          local_1320 = local_2140 + 1 + local_2094;
                          local_1324 = (local_213c + -1) - local_2094;
                          local_1318 = local_2058;
                          local_131c = local_2144;
                          local_1330 = local_2058;
                          local_1334 = local_2144;
                          local_1338 = local_2140;
                          local_133c = local_213c;
                          *(undefined4 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                               *(undefined4 *)
                                (*local_2058 +
                                ((long)(local_2144 - (int)local_2058[4]) +
                                 (long)(local_1320 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_1324 - (int)local_2058[5]) * local_2058[2]) * 4);
                          goto LAB_0169a549;
                        }
                      }
                      local_4a8 = local_2068;
                      local_4ac = 0;
                      if ((*local_2068 & 1) == 0) {
                        local_4b8 = local_2068;
                        local_4bc = 1;
                        if ((local_2068[1] & 1) == 0) {
                          local_4c8 = local_2070;
                          local_4cc = 2;
                          if ((local_2070[2] & 1) != 0) {
                            local_13b4 = (local_213c + -1) - local_2094;
                            local_13a8 = local_2058;
                            local_13ac = local_2144;
                            local_13b0 = local_2140;
                            local_13c0 = local_2058;
                            local_13c4 = local_2144;
                            local_13c8 = local_2140;
                            local_13cc = local_213c;
                            *(undefined4 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                 *(undefined4 *)
                                  (*local_2058 +
                                  ((long)(local_2144 - (int)local_2058[4]) +
                                   (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_13b4 - (int)local_2058[5]) * local_2058[2]) * 4);
                          }
                        }
                        else {
                          local_1380 = local_2140 + 1 + local_2094;
                          local_1378 = local_2058;
                          local_137c = local_2144;
                          local_1384 = local_213c;
                          local_1390 = local_2058;
                          local_1394 = local_2144;
                          local_1398 = local_2140;
                          local_139c = local_213c;
                          *(undefined4 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                               *(undefined4 *)
                                (*local_2058 +
                                ((long)(local_2144 - (int)local_2058[4]) +
                                 (long)(local_1380 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                        }
                      }
                      else {
                        local_134c = local_2144 + 1 + local_2094;
                        local_1348 = local_2058;
                        local_1350 = local_2140;
                        local_1354 = local_213c;
                        local_1360 = local_2058;
                        local_1364 = local_2144;
                        local_1368 = local_2140;
                        local_136c = local_213c;
                        *(undefined4 *)
                         (*local_2058 +
                         ((long)(local_2144 - (int)local_2058[4]) +
                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                             *(undefined4 *)
                              (*local_2058 +
                              ((long)(local_134c - (int)local_2058[4]) +
                               (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                               local_2058[1] +
                              (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                      }
                    }
                    else {
LAB_0169496a:
                      if (((local_2144 == (int)local_20c0 + 1) &&
                          (local_2140 == local_20a0._4_4_ + -1)) && (local_213c == local_20b8 + 1))
                      {
                        local_4d8 = local_2070;
                        local_4dc = 0;
                        if ((*local_2070 & 1) == 0) {
                          local_4e8 = local_2068;
                          local_4ec = 1;
                          if ((local_2068[1] & 1) == 0) {
                            local_4f8 = local_2070;
                            local_4fc = 2;
                            if ((local_2070[2] & 1) == 0) goto LAB_016953da;
                          }
                        }
                        local_508 = local_2070;
                        local_50c = 0;
                        if ((*local_2070 & 1) != 0) {
                          local_518 = local_2068;
                          local_51c = 1;
                          if ((local_2068[1] & 1) != 0) {
                            local_528 = local_2070;
                            local_52c = 2;
                            if ((local_2070[2] & 1) != 0) {
                              local_13dc = (local_2144 + -1) - local_2094;
                              local_13e0 = local_2140 + 1 + local_2094;
                              local_13e4 = (local_213c + -1) - local_2094;
                              local_13d8 = local_2058;
                              local_13f0 = local_2058;
                              local_13f4 = local_2144;
                              local_13f8 = local_2140;
                              local_13fc = local_213c;
                              *(undefined4 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                   *(undefined4 *)
                                    (*local_2058 +
                                    ((long)(local_13dc - (int)local_2058[4]) +
                                     (long)(local_13e0 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_13e4 - (int)local_2058[5]) * local_2058[2]) * 4);
                              goto LAB_0169a549;
                            }
                          }
                        }
                        local_538 = local_2070;
                        local_53c = 0;
                        if ((*local_2070 & 1) != 0) {
                          local_548 = local_2068;
                          local_54c = 1;
                          if ((local_2068[1] & 1) != 0) {
                            local_140c = (local_2144 + -1) - local_2094;
                            local_1410 = local_2140 + 1 + local_2094;
                            local_1408 = local_2058;
                            local_1414 = local_213c;
                            local_1420 = local_2058;
                            local_1424 = local_2144;
                            local_1428 = local_2140;
                            local_142c = local_213c;
                            *(undefined4 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                 *(undefined4 *)
                                  (*local_2058 +
                                  ((long)(local_140c - (int)local_2058[4]) +
                                   (long)(local_1410 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                            goto LAB_0169a549;
                          }
                        }
                        local_558 = local_2070;
                        local_55c = 0;
                        if ((*local_2070 & 1) != 0) {
                          local_568 = local_2070;
                          local_56c = 2;
                          if ((local_2070[2] & 1) != 0) {
                            local_143c = (local_2144 + -1) - local_2094;
                            local_1444 = (local_213c + -1) - local_2094;
                            local_1438 = local_2058;
                            local_1440 = local_2140;
                            local_1450 = local_2058;
                            local_1454 = local_2144;
                            local_1458 = local_2140;
                            local_145c = local_213c;
                            *(undefined4 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                 *(undefined4 *)
                                  (*local_2058 +
                                  ((long)(local_143c - (int)local_2058[4]) +
                                   (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_1444 - (int)local_2058[5]) * local_2058[2]) * 4);
                            goto LAB_0169a549;
                          }
                        }
                        local_578 = local_2068;
                        local_57c = 1;
                        if ((local_2068[1] & 1) != 0) {
                          local_588 = local_2070;
                          local_58c = 2;
                          if ((local_2070[2] & 1) != 0) {
                            local_1470 = local_2140 + 1 + local_2094;
                            local_1474 = (local_213c + -1) - local_2094;
                            local_1468 = local_2058;
                            local_146c = local_2144;
                            local_1480 = local_2058;
                            local_1484 = local_2144;
                            local_1488 = local_2140;
                            local_148c = local_213c;
                            *(undefined4 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                 *(undefined4 *)
                                  (*local_2058 +
                                  ((long)(local_2144 - (int)local_2058[4]) +
                                   (long)(local_1470 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_1474 - (int)local_2058[5]) * local_2058[2]) * 4);
                            goto LAB_0169a549;
                          }
                        }
                        local_598 = local_2070;
                        local_59c = 0;
                        if ((*local_2070 & 1) == 0) {
                          local_5a8 = local_2068;
                          local_5ac = 1;
                          if ((local_2068[1] & 1) == 0) {
                            local_5b8 = local_2070;
                            local_5bc = 2;
                            if ((local_2070[2] & 1) != 0) {
                              local_1504 = (local_213c + -1) - local_2094;
                              local_14f8 = local_2058;
                              local_14fc = local_2144;
                              local_1500 = local_2140;
                              local_1510 = local_2058;
                              local_1514 = local_2144;
                              local_1518 = local_2140;
                              local_151c = local_213c;
                              *(undefined4 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                   *(undefined4 *)
                                    (*local_2058 +
                                    ((long)(local_2144 - (int)local_2058[4]) +
                                     (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_1504 - (int)local_2058[5]) * local_2058[2]) * 4);
                            }
                          }
                          else {
                            local_14d0 = local_2140 + 1 + local_2094;
                            local_14c8 = local_2058;
                            local_14cc = local_2144;
                            local_14d4 = local_213c;
                            local_14e0 = local_2058;
                            local_14e4 = local_2144;
                            local_14e8 = local_2140;
                            local_14ec = local_213c;
                            *(undefined4 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                 *(undefined4 *)
                                  (*local_2058 +
                                  ((long)(local_2144 - (int)local_2058[4]) +
                                   (long)(local_14d0 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                          }
                        }
                        else {
                          local_149c = (local_2144 + -1) - local_2094;
                          local_1498 = local_2058;
                          local_14a0 = local_2140;
                          local_14a4 = local_213c;
                          local_14b0 = local_2058;
                          local_14b4 = local_2144;
                          local_14b8 = local_2140;
                          local_14bc = local_213c;
                          *(undefined4 *)
                           (*local_2058 +
                           ((long)(local_2144 - (int)local_2058[4]) +
                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1] +
                           (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                               *(undefined4 *)
                                (*local_2058 +
                                ((long)(local_149c - (int)local_2058[4]) +
                                 (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                 local_2058[1] +
                                (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                        }
                      }
                      else {
LAB_016953da:
                        if (((local_2144 == (int)local_20a0 + -1) &&
                            (local_2140 == local_20c0._4_4_ + 1)) && (local_213c == local_20b8 + 1))
                        {
                          local_5c8 = local_2068;
                          local_5cc = 0;
                          if ((*local_2068 & 1) == 0) {
                            local_5d8 = local_2070;
                            local_5dc = 1;
                            if ((local_2070[1] & 1) == 0) {
                              local_5e8 = local_2070;
                              local_5ec = 2;
                              if ((local_2070[2] & 1) == 0) goto LAB_01695e4a;
                            }
                          }
                          local_5f8 = local_2068;
                          local_5fc = 0;
                          if ((*local_2068 & 1) != 0) {
                            local_608 = local_2070;
                            local_60c = 1;
                            if ((local_2070[1] & 1) != 0) {
                              local_618 = local_2070;
                              local_61c = 2;
                              if ((local_2070[2] & 1) != 0) {
                                local_152c = local_2144 + 1 + local_2094;
                                local_1530 = (local_2140 + -1) - local_2094;
                                local_1534 = (local_213c + -1) - local_2094;
                                local_1528 = local_2058;
                                local_1540 = local_2058;
                                local_1544 = local_2144;
                                local_1548 = local_2140;
                                local_154c = local_213c;
                                *(undefined4 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                     *(undefined4 *)
                                      (*local_2058 +
                                      ((long)(local_152c - (int)local_2058[4]) +
                                       (long)(local_1530 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_1534 - (int)local_2058[5]) * local_2058[2]) * 4);
                                goto LAB_0169a549;
                              }
                            }
                          }
                          local_628 = local_2068;
                          local_62c = 0;
                          if ((*local_2068 & 1) != 0) {
                            local_638 = local_2070;
                            local_63c = 1;
                            if ((local_2070[1] & 1) != 0) {
                              local_155c = local_2144 + 1 + local_2094;
                              local_1560 = (local_2140 + -1) - local_2094;
                              local_1558 = local_2058;
                              local_1564 = local_213c;
                              local_1570 = local_2058;
                              local_1574 = local_2144;
                              local_1578 = local_2140;
                              local_157c = local_213c;
                              *(undefined4 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                   *(undefined4 *)
                                    (*local_2058 +
                                    ((long)(local_155c - (int)local_2058[4]) +
                                     (long)(local_1560 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                              goto LAB_0169a549;
                            }
                          }
                          local_648 = local_2068;
                          local_64c = 0;
                          if ((*local_2068 & 1) != 0) {
                            local_658 = local_2070;
                            local_65c = 2;
                            if ((local_2070[2] & 1) != 0) {
                              local_158c = local_2144 + 1 + local_2094;
                              local_1594 = (local_213c + -1) - local_2094;
                              local_1588 = local_2058;
                              local_1590 = local_2140;
                              local_15a0 = local_2058;
                              local_15a4 = local_2144;
                              local_15a8 = local_2140;
                              local_15ac = local_213c;
                              *(undefined4 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                   *(undefined4 *)
                                    (*local_2058 +
                                    ((long)(local_158c - (int)local_2058[4]) +
                                     (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_1594 - (int)local_2058[5]) * local_2058[2]) * 4);
                              goto LAB_0169a549;
                            }
                          }
                          local_668 = local_2070;
                          local_66c = 1;
                          if ((local_2070[1] & 1) != 0) {
                            local_678 = local_2070;
                            local_67c = 2;
                            if ((local_2070[2] & 1) != 0) {
                              local_15c0 = (local_2140 + -1) - local_2094;
                              local_15c4 = (local_213c + -1) - local_2094;
                              local_15b8 = local_2058;
                              local_15bc = local_2144;
                              local_15d0 = local_2058;
                              local_15d4 = local_2144;
                              local_15d8 = local_2140;
                              local_15dc = local_213c;
                              *(undefined4 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                   *(undefined4 *)
                                    (*local_2058 +
                                    ((long)(local_2144 - (int)local_2058[4]) +
                                     (long)(local_15c0 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_15c4 - (int)local_2058[5]) * local_2058[2]) * 4);
                              goto LAB_0169a549;
                            }
                          }
                          local_688 = local_2068;
                          local_68c = 0;
                          if ((*local_2068 & 1) == 0) {
                            local_698 = local_2070;
                            local_69c = 1;
                            if ((local_2070[1] & 1) == 0) {
                              local_6a8 = local_2070;
                              local_6ac = 2;
                              if ((local_2070[2] & 1) != 0) {
                                local_1654 = (local_213c + -1) - local_2094;
                                local_1648 = local_2058;
                                local_164c = local_2144;
                                local_1650 = local_2140;
                                local_1660 = local_2058;
                                local_1664 = local_2144;
                                local_1668 = local_2140;
                                local_166c = local_213c;
                                *(undefined4 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                     *(undefined4 *)
                                      (*local_2058 +
                                      ((long)(local_2144 - (int)local_2058[4]) +
                                       (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_1654 - (int)local_2058[5]) * local_2058[2]) * 4);
                              }
                            }
                            else {
                              local_1620 = (local_2140 + -1) - local_2094;
                              local_1618 = local_2058;
                              local_161c = local_2144;
                              local_1624 = local_213c;
                              local_1630 = local_2058;
                              local_1634 = local_2144;
                              local_1638 = local_2140;
                              local_163c = local_213c;
                              *(undefined4 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                   *(undefined4 *)
                                    (*local_2058 +
                                    ((long)(local_2144 - (int)local_2058[4]) +
                                     (long)(local_1620 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                            }
                          }
                          else {
                            local_15ec = local_2144 + 1 + local_2094;
                            local_15e8 = local_2058;
                            local_15f0 = local_2140;
                            local_15f4 = local_213c;
                            local_1600 = local_2058;
                            local_1604 = local_2144;
                            local_1608 = local_2140;
                            local_160c = local_213c;
                            *(undefined4 *)
                             (*local_2058 +
                             ((long)(local_2144 - (int)local_2058[4]) +
                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) * local_2058[1]
                             + (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                 *(undefined4 *)
                                  (*local_2058 +
                                  ((long)(local_15ec - (int)local_2058[4]) +
                                   (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                   local_2058[1] +
                                  (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                          }
                        }
                        else {
LAB_01695e4a:
                          if (((local_2144 == (int)local_20c0 + 1) &&
                              (local_2140 == local_20c0._4_4_ + 1)) &&
                             (local_213c == local_20b8 + 1)) {
                            local_6b8 = local_2070;
                            local_6bc = 0;
                            if ((*local_2070 & 1) == 0) {
                              local_6c8 = local_2070;
                              local_6cc = 1;
                              if ((local_2070[1] & 1) == 0) {
                                local_6d8 = local_2070;
                                local_6dc = 2;
                                if ((local_2070[2] & 1) == 0) goto LAB_016968ba;
                              }
                            }
                            local_6e8 = local_2070;
                            local_6ec = 0;
                            if ((*local_2070 & 1) != 0) {
                              local_6f8 = local_2070;
                              local_6fc = 1;
                              if ((local_2070[1] & 1) != 0) {
                                local_708 = local_2070;
                                local_70c = 2;
                                if ((local_2070[2] & 1) != 0) {
                                  local_167c = (local_2144 + -1) - local_2094;
                                  local_1680 = (local_2140 + -1) - local_2094;
                                  local_1684 = (local_213c + -1) - local_2094;
                                  local_1678 = local_2058;
                                  local_1690 = local_2058;
                                  local_1694 = local_2144;
                                  local_1698 = local_2140;
                                  local_169c = local_213c;
                                  *(undefined4 *)
                                   (*local_2058 +
                                   ((long)(local_2144 - (int)local_2058[4]) +
                                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                    local_2058[1] +
                                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                       *(undefined4 *)
                                        (*local_2058 +
                                        ((long)(local_167c - (int)local_2058[4]) +
                                         (long)(local_1680 - *(int *)((long)local_2058 + 0x24)) *
                                         local_2058[1] +
                                        (long)(local_1684 - (int)local_2058[5]) * local_2058[2]) * 4
                                        );
                                  goto LAB_0169a549;
                                }
                              }
                            }
                            local_718 = local_2070;
                            local_71c = 0;
                            if ((*local_2070 & 1) != 0) {
                              local_728 = local_2070;
                              local_72c = 1;
                              if ((local_2070[1] & 1) != 0) {
                                local_16ac = (local_2144 + -1) - local_2094;
                                local_16b0 = (local_2140 + -1) - local_2094;
                                local_16a8 = local_2058;
                                local_16b4 = local_213c;
                                local_16c0 = local_2058;
                                local_16c4 = local_2144;
                                local_16c8 = local_2140;
                                local_16cc = local_213c;
                                *(undefined4 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                     *(undefined4 *)
                                      (*local_2058 +
                                      ((long)(local_16ac - (int)local_2058[4]) +
                                       (long)(local_16b0 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                                goto LAB_0169a549;
                              }
                            }
                            local_738 = local_2070;
                            local_73c = 0;
                            if ((*local_2070 & 1) != 0) {
                              local_748 = local_2070;
                              local_74c = 2;
                              if ((local_2070[2] & 1) != 0) {
                                local_16dc = (local_2144 + -1) - local_2094;
                                local_16e4 = (local_213c + -1) - local_2094;
                                local_16d8 = local_2058;
                                local_16e0 = local_2140;
                                local_16f0 = local_2058;
                                local_16f4 = local_2144;
                                local_16f8 = local_2140;
                                local_16fc = local_213c;
                                *(undefined4 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                     *(undefined4 *)
                                      (*local_2058 +
                                      ((long)(local_16dc - (int)local_2058[4]) +
                                       (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_16e4 - (int)local_2058[5]) * local_2058[2]) * 4);
                                goto LAB_0169a549;
                              }
                            }
                            local_758 = local_2070;
                            local_75c = 1;
                            if ((local_2070[1] & 1) != 0) {
                              local_768 = local_2070;
                              local_76c = 2;
                              if ((local_2070[2] & 1) != 0) {
                                local_1710 = (local_2140 + -1) - local_2094;
                                local_1714 = (local_213c + -1) - local_2094;
                                local_1708 = local_2058;
                                local_170c = local_2144;
                                local_1720 = local_2058;
                                local_1724 = local_2144;
                                local_1728 = local_2140;
                                local_172c = local_213c;
                                *(undefined4 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                     *(undefined4 *)
                                      (*local_2058 +
                                      ((long)(local_2144 - (int)local_2058[4]) +
                                       (long)(local_1710 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_1714 - (int)local_2058[5]) * local_2058[2]) * 4);
                                goto LAB_0169a549;
                              }
                            }
                            local_778 = local_2070;
                            local_77c = 0;
                            if ((*local_2070 & 1) == 0) {
                              local_788 = local_2070;
                              local_78c = 1;
                              if ((local_2070[1] & 1) == 0) {
                                local_798 = local_2070;
                                local_79c = 2;
                                if ((local_2070[2] & 1) != 0) {
                                  local_17a4 = (local_213c + -1) - local_2094;
                                  local_1798 = local_2058;
                                  local_179c = local_2144;
                                  local_17a0 = local_2140;
                                  local_17b0 = local_2058;
                                  local_17b4 = local_2144;
                                  local_17b8 = local_2140;
                                  local_17bc = local_213c;
                                  *(undefined4 *)
                                   (*local_2058 +
                                   ((long)(local_2144 - (int)local_2058[4]) +
                                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                    local_2058[1] +
                                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                       *(undefined4 *)
                                        (*local_2058 +
                                        ((long)(local_2144 - (int)local_2058[4]) +
                                         (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                         local_2058[1] +
                                        (long)(local_17a4 - (int)local_2058[5]) * local_2058[2]) * 4
                                        );
                                }
                              }
                              else {
                                local_1770 = (local_2140 + -1) - local_2094;
                                local_1768 = local_2058;
                                local_176c = local_2144;
                                local_1774 = local_213c;
                                local_1780 = local_2058;
                                local_1784 = local_2144;
                                local_1788 = local_2140;
                                local_178c = local_213c;
                                *(undefined4 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                     *(undefined4 *)
                                      (*local_2058 +
                                      ((long)(local_2144 - (int)local_2058[4]) +
                                       (long)(local_1770 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                              }
                            }
                            else {
                              local_173c = (local_2144 + -1) - local_2094;
                              local_1738 = local_2058;
                              local_1740 = local_2140;
                              local_1744 = local_213c;
                              local_1750 = local_2058;
                              local_1754 = local_2144;
                              local_1758 = local_2140;
                              local_175c = local_213c;
                              *(undefined4 *)
                               (*local_2058 +
                               ((long)(local_2144 - (int)local_2058[4]) +
                                (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                local_2058[1] +
                               (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                   *(undefined4 *)
                                    (*local_2058 +
                                    ((long)(local_173c - (int)local_2058[4]) +
                                     (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                     local_2058[1] +
                                    (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                            }
                          }
                          else {
LAB_016968ba:
                            if ((local_2144 == (int)local_20a0 + -1) &&
                               (local_2140 == local_20a0._4_4_ + -1)) {
                              local_7a8 = local_2068;
                              local_7ac = 0;
                              if ((*local_2068 & 1) == 0) {
                                local_7b8 = local_2068;
                                local_7bc = 1;
                                if ((local_2068[1] & 1) == 0) goto LAB_01696d1f;
                              }
                              local_7c8 = local_2068;
                              local_7cc = 0;
                              if ((*local_2068 & 1) != 0) {
                                local_7d8 = local_2068;
                                local_7dc = 1;
                                if ((local_2068[1] & 1) != 0) {
                                  local_17cc = local_2144 + 1 + local_2094;
                                  local_17d0 = local_2140 + 1 + local_2094;
                                  local_17c8 = local_2058;
                                  local_17d4 = local_213c;
                                  local_17e0 = local_2058;
                                  local_17e4 = local_2144;
                                  local_17e8 = local_2140;
                                  local_17ec = local_213c;
                                  *(undefined4 *)
                                   (*local_2058 +
                                   ((long)(local_2144 - (int)local_2058[4]) +
                                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                    local_2058[1] +
                                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                       *(undefined4 *)
                                        (*local_2058 +
                                        ((long)(local_17cc - (int)local_2058[4]) +
                                         (long)(local_17d0 - *(int *)((long)local_2058 + 0x24)) *
                                         local_2058[1] +
                                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4
                                        );
                                  goto LAB_0169a549;
                                }
                              }
                              local_7e8 = local_2068;
                              local_7ec = 0;
                              if ((*local_2068 & 1) == 0) {
                                local_7f8 = local_2068;
                                local_7fc = 1;
                                if ((local_2068[1] & 1) != 0) {
                                  local_1830 = local_2140 + 1 + local_2094;
                                  local_1828 = local_2058;
                                  local_182c = local_2144;
                                  local_1834 = local_213c;
                                  local_1840 = local_2058;
                                  local_1844 = local_2144;
                                  local_1848 = local_2140;
                                  local_184c = local_213c;
                                  *(undefined4 *)
                                   (*local_2058 +
                                   ((long)(local_2144 - (int)local_2058[4]) +
                                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                    local_2058[1] +
                                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                       *(undefined4 *)
                                        (*local_2058 +
                                        ((long)(local_2144 - (int)local_2058[4]) +
                                         (long)(local_1830 - *(int *)((long)local_2058 + 0x24)) *
                                         local_2058[1] +
                                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4
                                        );
                                }
                              }
                              else {
                                local_17fc = local_2144 + 1 + local_2094;
                                local_17f8 = local_2058;
                                local_1800 = local_2140;
                                local_1804 = local_213c;
                                local_1810 = local_2058;
                                local_1814 = local_2144;
                                local_1818 = local_2140;
                                local_181c = local_213c;
                                *(undefined4 *)
                                 (*local_2058 +
                                 ((long)(local_2144 - (int)local_2058[4]) +
                                  (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                  local_2058[1] +
                                 (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                     *(undefined4 *)
                                      (*local_2058 +
                                      ((long)(local_17fc - (int)local_2058[4]) +
                                       (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                       local_2058[1] +
                                      (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4);
                              }
                            }
                            else {
LAB_01696d1f:
                              if ((local_2144 == (int)local_20c0 + 1) &&
                                 (local_2140 == local_20a0._4_4_ + -1)) {
                                local_808 = local_2070;
                                local_80c = 0;
                                if ((*local_2070 & 1) == 0) {
                                  local_818 = local_2068;
                                  local_81c = 1;
                                  if ((local_2068[1] & 1) == 0) goto LAB_01697184;
                                }
                                local_828 = local_2070;
                                local_82c = 0;
                                if ((*local_2070 & 1) != 0) {
                                  local_838 = local_2068;
                                  local_83c = 1;
                                  if ((local_2068[1] & 1) != 0) {
                                    local_185c = (local_2144 + -1) - local_2094;
                                    local_1860 = local_2140 + 1 + local_2094;
                                    local_1858 = local_2058;
                                    local_1864 = local_213c;
                                    local_1870 = local_2058;
                                    local_1874 = local_2144;
                                    local_1878 = local_2140;
                                    local_187c = local_213c;
                                    *(undefined4 *)
                                     (*local_2058 +
                                     ((long)(local_2144 - (int)local_2058[4]) +
                                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                      local_2058[1] +
                                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                         *(undefined4 *)
                                          (*local_2058 +
                                          ((long)(local_185c - (int)local_2058[4]) +
                                           (long)(local_1860 - *(int *)((long)local_2058 + 0x24)) *
                                           local_2058[1] +
                                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                          4);
                                    goto LAB_0169a549;
                                  }
                                }
                                local_848 = local_2070;
                                local_84c = 0;
                                if ((*local_2070 & 1) == 0) {
                                  local_858 = local_2068;
                                  local_85c = 1;
                                  if ((local_2068[1] & 1) != 0) {
                                    local_18c0 = local_2140 + 1 + local_2094;
                                    local_18b8 = local_2058;
                                    local_18bc = local_2144;
                                    local_18c4 = local_213c;
                                    local_18d0 = local_2058;
                                    local_18d4 = local_2144;
                                    local_18d8 = local_2140;
                                    local_18dc = local_213c;
                                    *(undefined4 *)
                                     (*local_2058 +
                                     ((long)(local_2144 - (int)local_2058[4]) +
                                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                      local_2058[1] +
                                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                         *(undefined4 *)
                                          (*local_2058 +
                                          ((long)(local_2144 - (int)local_2058[4]) +
                                           (long)(local_18c0 - *(int *)((long)local_2058 + 0x24)) *
                                           local_2058[1] +
                                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                          4);
                                  }
                                }
                                else {
                                  local_188c = (local_2144 + -1) - local_2094;
                                  local_1888 = local_2058;
                                  local_1890 = local_2140;
                                  local_1894 = local_213c;
                                  local_18a0 = local_2058;
                                  local_18a4 = local_2144;
                                  local_18a8 = local_2140;
                                  local_18ac = local_213c;
                                  *(undefined4 *)
                                   (*local_2058 +
                                   ((long)(local_2144 - (int)local_2058[4]) +
                                    (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                    local_2058[1] +
                                   (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                       *(undefined4 *)
                                        (*local_2058 +
                                        ((long)(local_188c - (int)local_2058[4]) +
                                         (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                         local_2058[1] +
                                        (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4
                                        );
                                }
                              }
                              else {
LAB_01697184:
                                if ((local_2144 == (int)local_20a0 + -1) &&
                                   (local_2140 == local_20c0._4_4_ + 1)) {
                                  local_868 = local_2068;
                                  local_86c = 0;
                                  if ((*local_2068 & 1) == 0) {
                                    local_878 = local_2070;
                                    local_87c = 1;
                                    if ((local_2070[1] & 1) == 0) goto LAB_016975e9;
                                  }
                                  local_888 = local_2068;
                                  local_88c = 0;
                                  if ((*local_2068 & 1) != 0) {
                                    local_898 = local_2070;
                                    local_89c = 1;
                                    if ((local_2070[1] & 1) != 0) {
                                      local_18ec = local_2144 + 1 + local_2094;
                                      local_18f0 = (local_2140 + -1) - local_2094;
                                      local_18e8 = local_2058;
                                      local_18f4 = local_213c;
                                      local_1900 = local_2058;
                                      local_1904 = local_2144;
                                      local_1908 = local_2140;
                                      local_190c = local_213c;
                                      *(undefined4 *)
                                       (*local_2058 +
                                       ((long)(local_2144 - (int)local_2058[4]) +
                                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                        local_2058[1] +
                                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4)
                                           = *(undefined4 *)
                                              (*local_2058 +
                                              ((long)(local_18ec - (int)local_2058[4]) +
                                               (long)(local_18f0 - *(int *)((long)local_2058 + 0x24)
                                                     ) * local_2058[1] +
                                              (long)(local_213c - (int)local_2058[5]) *
                                              local_2058[2]) * 4);
                                      goto LAB_0169a549;
                                    }
                                  }
                                  local_8a8 = local_2068;
                                  local_8ac = 0;
                                  if ((*local_2068 & 1) == 0) {
                                    local_8b8 = local_2070;
                                    local_8bc = 1;
                                    if ((local_2070[1] & 1) != 0) {
                                      local_1950 = (local_2140 + -1) - local_2094;
                                      local_1948 = local_2058;
                                      local_194c = local_2144;
                                      local_1954 = local_213c;
                                      local_1960 = local_2058;
                                      local_1964 = local_2144;
                                      local_1968 = local_2140;
                                      local_196c = local_213c;
                                      *(undefined4 *)
                                       (*local_2058 +
                                       ((long)(local_2144 - (int)local_2058[4]) +
                                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                        local_2058[1] +
                                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4)
                                           = *(undefined4 *)
                                              (*local_2058 +
                                              ((long)(local_2144 - (int)local_2058[4]) +
                                               (long)(local_1950 - *(int *)((long)local_2058 + 0x24)
                                                     ) * local_2058[1] +
                                              (long)(local_213c - (int)local_2058[5]) *
                                              local_2058[2]) * 4);
                                    }
                                  }
                                  else {
                                    local_191c = local_2144 + 1 + local_2094;
                                    local_1918 = local_2058;
                                    local_1920 = local_2140;
                                    local_1924 = local_213c;
                                    local_1930 = local_2058;
                                    local_1934 = local_2144;
                                    local_1938 = local_2140;
                                    local_193c = local_213c;
                                    *(undefined4 *)
                                     (*local_2058 +
                                     ((long)(local_2144 - (int)local_2058[4]) +
                                      (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                      local_2058[1] +
                                     (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4) =
                                         *(undefined4 *)
                                          (*local_2058 +
                                          ((long)(local_191c - (int)local_2058[4]) +
                                           (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                           local_2058[1] +
                                          (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                          4);
                                  }
                                }
                                else {
LAB_016975e9:
                                  if ((local_2144 == (int)local_20c0 + 1) &&
                                     (local_2140 == local_20c0._4_4_ + 1)) {
                                    local_8c8 = local_2070;
                                    local_8cc = 0;
                                    if ((*local_2070 & 1) == 0) {
                                      local_8d8 = local_2070;
                                      local_8dc = 1;
                                      if ((local_2070[1] & 1) == 0) goto LAB_01697a4e;
                                    }
                                    local_8e8 = local_2070;
                                    local_8ec = 0;
                                    if ((*local_2070 & 1) != 0) {
                                      local_8f8 = local_2070;
                                      local_8fc = 1;
                                      if ((local_2070[1] & 1) != 0) {
                                        local_197c = (local_2144 + -1) - local_2094;
                                        local_1980 = (local_2140 + -1) - local_2094;
                                        local_1978 = local_2058;
                                        local_1984 = local_213c;
                                        local_1990 = local_2058;
                                        local_1994 = local_2144;
                                        local_1998 = local_2140;
                                        local_199c = local_213c;
                                        *(undefined4 *)
                                         (*local_2058 +
                                         ((long)(local_2144 - (int)local_2058[4]) +
                                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                          local_2058[1] +
                                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                         4) = *(undefined4 *)
                                               (*local_2058 +
                                               ((long)(local_197c - (int)local_2058[4]) +
                                                (long)(local_1980 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 4);
                                        goto LAB_0169a549;
                                      }
                                    }
                                    local_908 = local_2070;
                                    local_90c = 0;
                                    if ((*local_2070 & 1) == 0) {
                                      local_918 = local_2070;
                                      local_91c = 1;
                                      if ((local_2070[1] & 1) != 0) {
                                        local_19e0 = (local_2140 + -1) - local_2094;
                                        local_19d8 = local_2058;
                                        local_19dc = local_2144;
                                        local_19e4 = local_213c;
                                        local_19f0 = local_2058;
                                        local_19f4 = local_2144;
                                        local_19f8 = local_2140;
                                        local_19fc = local_213c;
                                        *(undefined4 *)
                                         (*local_2058 +
                                         ((long)(local_2144 - (int)local_2058[4]) +
                                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                          local_2058[1] +
                                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                         4) = *(undefined4 *)
                                               (*local_2058 +
                                               ((long)(local_2144 - (int)local_2058[4]) +
                                                (long)(local_19e0 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 4);
                                      }
                                    }
                                    else {
                                      local_19ac = (local_2144 + -1) - local_2094;
                                      local_19a8 = local_2058;
                                      local_19b0 = local_2140;
                                      local_19b4 = local_213c;
                                      local_19c0 = local_2058;
                                      local_19c4 = local_2144;
                                      local_19c8 = local_2140;
                                      local_19cc = local_213c;
                                      *(undefined4 *)
                                       (*local_2058 +
                                       ((long)(local_2144 - (int)local_2058[4]) +
                                        (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                        local_2058[1] +
                                       (long)(local_213c - (int)local_2058[5]) * local_2058[2]) * 4)
                                           = *(undefined4 *)
                                              (*local_2058 +
                                              ((long)(local_19ac - (int)local_2058[4]) +
                                               (long)(local_2140 - *(int *)((long)local_2058 + 0x24)
                                                     ) * local_2058[1] +
                                              (long)(local_213c - (int)local_2058[5]) *
                                              local_2058[2]) * 4);
                                    }
                                  }
                                  else {
LAB_01697a4e:
                                    if ((local_2144 == (int)local_20a0 + -1) &&
                                       (local_213c == local_2098 + -1)) {
                                      local_928 = local_2068;
                                      local_92c = 0;
                                      if ((*local_2068 & 1) == 0) {
                                        local_938 = local_2068;
                                        local_93c = 2;
                                        if ((local_2068[2] & 1) == 0) goto LAB_01697eb3;
                                      }
                                      local_948 = local_2068;
                                      local_94c = 0;
                                      if ((*local_2068 & 1) != 0) {
                                        local_958 = local_2068;
                                        local_95c = 2;
                                        if ((local_2068[2] & 1) != 0) {
                                          local_1a0c = local_2144 + 1 + local_2094;
                                          local_1a14 = local_213c + 1 + local_2094;
                                          local_1a08 = local_2058;
                                          local_1a10 = local_2140;
                                          local_1a20 = local_2058;
                                          local_1a24 = local_2144;
                                          local_1a28 = local_2140;
                                          local_1a2c = local_213c;
                                          *(undefined4 *)
                                           (*local_2058 +
                                           ((long)(local_2144 - (int)local_2058[4]) +
                                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                            local_2058[1] +
                                           (long)(local_213c - (int)local_2058[5]) * local_2058[2])
                                           * 4) = *(undefined4 *)
                                                   (*local_2058 +
                                                   ((long)(local_1a0c - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_1a14 - (int)local_2058[5]) *
                                                   local_2058[2]) * 4);
                                          goto LAB_0169a549;
                                        }
                                      }
                                      local_968 = local_2068;
                                      local_96c = 0;
                                      if ((*local_2068 & 1) == 0) {
                                        local_978 = local_2068;
                                        local_97c = 2;
                                        if ((local_2068[2] & 1) != 0) {
                                          local_1a74 = local_213c + 1 + local_2094;
                                          local_1a68 = local_2058;
                                          local_1a6c = local_2144;
                                          local_1a70 = local_2140;
                                          local_1a80 = local_2058;
                                          local_1a84 = local_2144;
                                          local_1a88 = local_2140;
                                          local_1a8c = local_213c;
                                          *(undefined4 *)
                                           (*local_2058 +
                                           ((long)(local_2144 - (int)local_2058[4]) +
                                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                            local_2058[1] +
                                           (long)(local_213c - (int)local_2058[5]) * local_2058[2])
                                           * 4) = *(undefined4 *)
                                                   (*local_2058 +
                                                   ((long)(local_2144 - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_1a74 - (int)local_2058[5]) *
                                                   local_2058[2]) * 4);
                                        }
                                      }
                                      else {
                                        local_1a3c = local_2144 + 1 + local_2094;
                                        local_1a38 = local_2058;
                                        local_1a40 = local_2140;
                                        local_1a44 = local_213c;
                                        local_1a50 = local_2058;
                                        local_1a54 = local_2144;
                                        local_1a58 = local_2140;
                                        local_1a5c = local_213c;
                                        *(undefined4 *)
                                         (*local_2058 +
                                         ((long)(local_2144 - (int)local_2058[4]) +
                                          (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                          local_2058[1] +
                                         (long)(local_213c - (int)local_2058[5]) * local_2058[2]) *
                                         4) = *(undefined4 *)
                                               (*local_2058 +
                                               ((long)(local_1a3c - (int)local_2058[4]) +
                                                (long)(local_2140 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 4);
                                      }
                                    }
                                    else {
LAB_01697eb3:
                                      if ((local_2144 == (int)local_20c0 + 1) &&
                                         (local_213c == local_2098 + -1)) {
                                        local_988 = local_2070;
                                        local_98c = 0;
                                        if ((*local_2070 & 1) == 0) {
                                          local_998 = local_2068;
                                          local_99c = 2;
                                          if ((local_2068[2] & 1) == 0) goto LAB_01698318;
                                        }
                                        local_9a8 = local_2070;
                                        local_9ac = 0;
                                        if ((*local_2070 & 1) != 0) {
                                          local_9b8 = local_2068;
                                          local_9bc = 2;
                                          if ((local_2068[2] & 1) != 0) {
                                            local_1a9c = (local_2144 + -1) - local_2094;
                                            local_1aa4 = local_213c + 1 + local_2094;
                                            local_1a98 = local_2058;
                                            local_1aa0 = local_2140;
                                            local_1ab0 = local_2058;
                                            local_1ab4 = local_2144;
                                            local_1ab8 = local_2140;
                                            local_1abc = local_213c;
                                            *(undefined4 *)
                                             (*local_2058 +
                                             ((long)(local_2144 - (int)local_2058[4]) +
                                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24))
                                              * local_2058[1] +
                                             (long)(local_213c - (int)local_2058[5]) * local_2058[2]
                                             ) * 4) = *(undefined4 *)
                                                       (*local_2058 +
                                                       ((long)(local_1a9c - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_1aa4 - (int)local_2058[5]) *
                                                       local_2058[2]) * 4);
                                            goto LAB_0169a549;
                                          }
                                        }
                                        local_9c8 = local_2070;
                                        local_9cc = 0;
                                        if ((*local_2070 & 1) == 0) {
                                          local_9d8 = local_2068;
                                          local_9dc = 2;
                                          if ((local_2068[2] & 1) != 0) {
                                            local_1b04 = local_213c + 1 + local_2094;
                                            local_1af8 = local_2058;
                                            local_1afc = local_2144;
                                            local_1b00 = local_2140;
                                            local_1b10 = local_2058;
                                            local_1b14 = local_2144;
                                            local_1b18 = local_2140;
                                            local_1b1c = local_213c;
                                            *(undefined4 *)
                                             (*local_2058 +
                                             ((long)(local_2144 - (int)local_2058[4]) +
                                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24))
                                              * local_2058[1] +
                                             (long)(local_213c - (int)local_2058[5]) * local_2058[2]
                                             ) * 4) = *(undefined4 *)
                                                       (*local_2058 +
                                                       ((long)(local_2144 - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_1b04 - (int)local_2058[5]) *
                                                       local_2058[2]) * 4);
                                          }
                                        }
                                        else {
                                          local_1acc = (local_2144 + -1) - local_2094;
                                          local_1ac8 = local_2058;
                                          local_1ad0 = local_2140;
                                          local_1ad4 = local_213c;
                                          local_1ae0 = local_2058;
                                          local_1ae4 = local_2144;
                                          local_1ae8 = local_2140;
                                          local_1aec = local_213c;
                                          *(undefined4 *)
                                           (*local_2058 +
                                           ((long)(local_2144 - (int)local_2058[4]) +
                                            (long)(local_2140 - *(int *)((long)local_2058 + 0x24)) *
                                            local_2058[1] +
                                           (long)(local_213c - (int)local_2058[5]) * local_2058[2])
                                           * 4) = *(undefined4 *)
                                                   (*local_2058 +
                                                   ((long)(local_1acc - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_213c - (int)local_2058[5]) *
                                                   local_2058[2]) * 4);
                                        }
                                      }
                                      else {
LAB_01698318:
                                        if ((local_2144 == (int)local_20a0 + -1) &&
                                           (local_213c == local_20b8 + 1)) {
                                          local_9e8 = local_2068;
                                          local_9ec = 0;
                                          if ((*local_2068 & 1) == 0) {
                                            local_9f8 = local_2070;
                                            local_9fc = 2;
                                            if ((local_2070[2] & 1) == 0) goto LAB_0169877d;
                                          }
                                          local_a08 = local_2068;
                                          local_a0c = 0;
                                          if ((*local_2068 & 1) != 0) {
                                            local_a18 = local_2070;
                                            local_a1c = 2;
                                            if ((local_2070[2] & 1) != 0) {
                                              local_1b2c = local_2144 + 1 + local_2094;
                                              local_1b34 = (local_213c + -1) - local_2094;
                                              local_1b28 = local_2058;
                                              local_1b30 = local_2140;
                                              local_1b40 = local_2058;
                                              local_1b44 = local_2144;
                                              local_1b48 = local_2140;
                                              local_1b4c = local_213c;
                                              *(undefined4 *)
                                               (*local_2058 +
                                               ((long)(local_2144 - (int)local_2058[4]) +
                                                (long)(local_2140 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 4) =
                                                   *(undefined4 *)
                                                    (*local_2058 +
                                                    ((long)(local_1b2c - (int)local_2058[4]) +
                                                     (long)(local_2140 -
                                                           *(int *)((long)local_2058 + 0x24)) *
                                                     local_2058[1] +
                                                    (long)(local_1b34 - (int)local_2058[5]) *
                                                    local_2058[2]) * 4);
                                              goto LAB_0169a549;
                                            }
                                          }
                                          local_a28 = local_2068;
                                          local_a2c = 0;
                                          if ((*local_2068 & 1) == 0) {
                                            local_a38 = local_2070;
                                            local_a3c = 2;
                                            if ((local_2070[2] & 1) != 0) {
                                              local_1b94 = (local_213c + -1) - local_2094;
                                              local_1b88 = local_2058;
                                              local_1b8c = local_2144;
                                              local_1b90 = local_2140;
                                              local_1ba0 = local_2058;
                                              local_1ba4 = local_2144;
                                              local_1ba8 = local_2140;
                                              local_1bac = local_213c;
                                              *(undefined4 *)
                                               (*local_2058 +
                                               ((long)(local_2144 - (int)local_2058[4]) +
                                                (long)(local_2140 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 4) =
                                                   *(undefined4 *)
                                                    (*local_2058 +
                                                    ((long)(local_2144 - (int)local_2058[4]) +
                                                     (long)(local_2140 -
                                                           *(int *)((long)local_2058 + 0x24)) *
                                                     local_2058[1] +
                                                    (long)(local_1b94 - (int)local_2058[5]) *
                                                    local_2058[2]) * 4);
                                            }
                                          }
                                          else {
                                            local_1b5c = local_2144 + 1 + local_2094;
                                            local_1b58 = local_2058;
                                            local_1b60 = local_2140;
                                            local_1b64 = local_213c;
                                            local_1b70 = local_2058;
                                            local_1b74 = local_2144;
                                            local_1b78 = local_2140;
                                            local_1b7c = local_213c;
                                            *(undefined4 *)
                                             (*local_2058 +
                                             ((long)(local_2144 - (int)local_2058[4]) +
                                              (long)(local_2140 - *(int *)((long)local_2058 + 0x24))
                                              * local_2058[1] +
                                             (long)(local_213c - (int)local_2058[5]) * local_2058[2]
                                             ) * 4) = *(undefined4 *)
                                                       (*local_2058 +
                                                       ((long)(local_1b5c - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_213c - (int)local_2058[5]) *
                                                       local_2058[2]) * 4);
                                          }
                                        }
                                        else {
LAB_0169877d:
                                          if ((local_2144 == (int)local_20c0 + 1) &&
                                             (local_213c == local_20b8 + 1)) {
                                            local_a48 = local_2070;
                                            local_a4c = 0;
                                            if ((*local_2070 & 1) == 0) {
                                              local_a58 = local_2070;
                                              local_a5c = 2;
                                              if ((local_2070[2] & 1) == 0) goto LAB_01698be2;
                                            }
                                            local_a68 = local_2070;
                                            local_a6c = 0;
                                            if ((*local_2070 & 1) != 0) {
                                              local_a78 = local_2070;
                                              local_a7c = 2;
                                              if ((local_2070[2] & 1) != 0) {
                                                local_1bbc = (local_2144 + -1) - local_2094;
                                                local_1bc4 = (local_213c + -1) - local_2094;
                                                local_1bb8 = local_2058;
                                                local_1bc0 = local_2140;
                                                local_1bd0 = local_2058;
                                                local_1bd4 = local_2144;
                                                local_1bd8 = local_2140;
                                                local_1bdc = local_213c;
                                                *(undefined4 *)
                                                 (*local_2058 +
                                                 ((long)(local_2144 - (int)local_2058[4]) +
                                                  (long)(local_2140 -
                                                        *(int *)((long)local_2058 + 0x24)) *
                                                  local_2058[1] +
                                                 (long)(local_213c - (int)local_2058[5]) *
                                                 local_2058[2]) * 4) =
                                                     *(undefined4 *)
                                                      (*local_2058 +
                                                      ((long)(local_1bbc - (int)local_2058[4]) +
                                                       (long)(local_2140 -
                                                             *(int *)((long)local_2058 + 0x24)) *
                                                       local_2058[1] +
                                                      (long)(local_1bc4 - (int)local_2058[5]) *
                                                      local_2058[2]) * 4);
                                                goto LAB_0169a549;
                                              }
                                            }
                                            local_a88 = local_2070;
                                            local_a8c = 0;
                                            if ((*local_2070 & 1) == 0) {
                                              local_a98 = local_2070;
                                              local_a9c = 2;
                                              if ((local_2070[2] & 1) != 0) {
                                                local_1c24 = (local_213c + -1) - local_2094;
                                                local_1c18 = local_2058;
                                                local_1c1c = local_2144;
                                                local_1c20 = local_2140;
                                                local_1c30 = local_2058;
                                                local_1c34 = local_2144;
                                                local_1c38 = local_2140;
                                                local_1c3c = local_213c;
                                                *(undefined4 *)
                                                 (*local_2058 +
                                                 ((long)(local_2144 - (int)local_2058[4]) +
                                                  (long)(local_2140 -
                                                        *(int *)((long)local_2058 + 0x24)) *
                                                  local_2058[1] +
                                                 (long)(local_213c - (int)local_2058[5]) *
                                                 local_2058[2]) * 4) =
                                                     *(undefined4 *)
                                                      (*local_2058 +
                                                      ((long)(local_2144 - (int)local_2058[4]) +
                                                       (long)(local_2140 -
                                                             *(int *)((long)local_2058 + 0x24)) *
                                                       local_2058[1] +
                                                      (long)(local_1c24 - (int)local_2058[5]) *
                                                      local_2058[2]) * 4);
                                              }
                                            }
                                            else {
                                              local_1bec = (local_2144 + -1) - local_2094;
                                              local_1be8 = local_2058;
                                              local_1bf0 = local_2140;
                                              local_1bf4 = local_213c;
                                              local_1c00 = local_2058;
                                              local_1c04 = local_2144;
                                              local_1c08 = local_2140;
                                              local_1c0c = local_213c;
                                              *(undefined4 *)
                                               (*local_2058 +
                                               ((long)(local_2144 - (int)local_2058[4]) +
                                                (long)(local_2140 -
                                                      *(int *)((long)local_2058 + 0x24)) *
                                                local_2058[1] +
                                               (long)(local_213c - (int)local_2058[5]) *
                                               local_2058[2]) * 4) =
                                                   *(undefined4 *)
                                                    (*local_2058 +
                                                    ((long)(local_1bec - (int)local_2058[4]) +
                                                     (long)(local_2140 -
                                                           *(int *)((long)local_2058 + 0x24)) *
                                                     local_2058[1] +
                                                    (long)(local_213c - (int)local_2058[5]) *
                                                    local_2058[2]) * 4);
                                            }
                                          }
                                          else {
LAB_01698be2:
                                            if ((local_2140 == local_20a0._4_4_ + -1) &&
                                               (local_213c == local_2098 + -1)) {
                                              local_aa8 = local_2068;
                                              local_aac = 1;
                                              if ((local_2068[1] & 1) == 0) {
                                                local_ab8 = local_2068;
                                                local_abc = 2;
                                                if ((local_2068[2] & 1) == 0) goto LAB_01699047;
                                              }
                                              local_ac8 = local_2068;
                                              local_acc = 1;
                                              if ((local_2068[1] & 1) != 0) {
                                                local_ad8 = local_2068;
                                                local_adc = 2;
                                                if ((local_2068[2] & 1) != 0) {
                                                  local_1c50 = local_2140 + 1 + local_2094;
                                                  local_1c54 = local_213c + 1 + local_2094;
                                                  local_1c48 = local_2058;
                                                  local_1c4c = local_2144;
                                                  local_1c60 = local_2058;
                                                  local_1c64 = local_2144;
                                                  local_1c68 = local_2140;
                                                  local_1c6c = local_213c;
                                                  *(undefined4 *)
                                                   (*local_2058 +
                                                   ((long)(local_2144 - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_213c - (int)local_2058[5]) *
                                                   local_2058[2]) * 4) =
                                                       *(undefined4 *)
                                                        (*local_2058 +
                                                        ((long)(local_2144 - (int)local_2058[4]) +
                                                         (long)(local_1c50 -
                                                               *(int *)((long)local_2058 + 0x24)) *
                                                         local_2058[1] +
                                                        (long)(local_1c54 - (int)local_2058[5]) *
                                                        local_2058[2]) * 4);
                                                  goto LAB_0169a549;
                                                }
                                              }
                                              local_ae8 = local_2068;
                                              local_aec = 1;
                                              if ((local_2068[1] & 1) == 0) {
                                                local_af8 = local_2068;
                                                local_afc = 2;
                                                if ((local_2068[2] & 1) != 0) {
                                                  local_1cb4 = local_213c + 1 + local_2094;
                                                  local_1ca8 = local_2058;
                                                  local_1cac = local_2144;
                                                  local_1cb0 = local_2140;
                                                  local_1cc0 = local_2058;
                                                  local_1cc4 = local_2144;
                                                  local_1cc8 = local_2140;
                                                  local_1ccc = local_213c;
                                                  *(undefined4 *)
                                                   (*local_2058 +
                                                   ((long)(local_2144 - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_213c - (int)local_2058[5]) *
                                                   local_2058[2]) * 4) =
                                                       *(undefined4 *)
                                                        (*local_2058 +
                                                        ((long)(local_2144 - (int)local_2058[4]) +
                                                         (long)(local_2140 -
                                                               *(int *)((long)local_2058 + 0x24)) *
                                                         local_2058[1] +
                                                        (long)(local_1cb4 - (int)local_2058[5]) *
                                                        local_2058[2]) * 4);
                                                }
                                              }
                                              else {
                                                local_1c80 = local_2140 + 1 + local_2094;
                                                local_1c78 = local_2058;
                                                local_1c7c = local_2144;
                                                local_1c84 = local_213c;
                                                local_1c90 = local_2058;
                                                local_1c94 = local_2144;
                                                local_1c98 = local_2140;
                                                local_1c9c = local_213c;
                                                *(undefined4 *)
                                                 (*local_2058 +
                                                 ((long)(local_2144 - (int)local_2058[4]) +
                                                  (long)(local_2140 -
                                                        *(int *)((long)local_2058 + 0x24)) *
                                                  local_2058[1] +
                                                 (long)(local_213c - (int)local_2058[5]) *
                                                 local_2058[2]) * 4) =
                                                     *(undefined4 *)
                                                      (*local_2058 +
                                                      ((long)(local_2144 - (int)local_2058[4]) +
                                                       (long)(local_1c80 -
                                                             *(int *)((long)local_2058 + 0x24)) *
                                                       local_2058[1] +
                                                      (long)(local_213c - (int)local_2058[5]) *
                                                      local_2058[2]) * 4);
                                              }
                                            }
                                            else {
LAB_01699047:
                                              if ((local_2140 == local_20c0._4_4_ + 1) &&
                                                 (local_213c == local_2098 + -1)) {
                                                local_b08 = local_2070;
                                                local_b0c = 1;
                                                if ((local_2070[1] & 1) == 0) {
                                                  local_b18 = local_2068;
                                                  local_b1c = 2;
                                                  if ((local_2068[2] & 1) == 0) goto LAB_016994ac;
                                                }
                                                local_b28 = local_2070;
                                                local_b2c = 1;
                                                if ((local_2070[1] & 1) != 0) {
                                                  local_b38 = local_2068;
                                                  local_b3c = 2;
                                                  if ((local_2068[2] & 1) != 0) {
                                                    local_1ce0 = (local_2140 + -1) - local_2094;
                                                    local_1ce4 = local_213c + 1 + local_2094;
                                                    local_1cd8 = local_2058;
                                                    local_1cdc = local_2144;
                                                    local_1cf0 = local_2058;
                                                    local_1cf4 = local_2144;
                                                    local_1cf8 = local_2140;
                                                    local_1cfc = local_213c;
                                                    *(undefined4 *)
                                                     (*local_2058 +
                                                     ((long)(local_2144 - (int)local_2058[4]) +
                                                      (long)(local_2140 -
                                                            *(int *)((long)local_2058 + 0x24)) *
                                                      local_2058[1] +
                                                     (long)(local_213c - (int)local_2058[5]) *
                                                     local_2058[2]) * 4) =
                                                         *(undefined4 *)
                                                          (*local_2058 +
                                                          ((long)(local_2144 - (int)local_2058[4]) +
                                                           (long)(local_1ce0 -
                                                                 *(int *)((long)local_2058 + 0x24))
                                                           * local_2058[1] +
                                                          (long)(local_1ce4 - (int)local_2058[5]) *
                                                          local_2058[2]) * 4);
                                                    goto LAB_0169a549;
                                                  }
                                                }
                                                local_b48 = local_2070;
                                                local_b4c = 1;
                                                if ((local_2070[1] & 1) == 0) {
                                                  local_b58 = local_2068;
                                                  local_b5c = 2;
                                                  if ((local_2068[2] & 1) != 0) {
                                                    local_1d44 = local_213c + 1 + local_2094;
                                                    local_1d38 = local_2058;
                                                    local_1d3c = local_2144;
                                                    local_1d40 = local_2140;
                                                    local_1d50 = local_2058;
                                                    local_1d54 = local_2144;
                                                    local_1d58 = local_2140;
                                                    local_1d5c = local_213c;
                                                    *(undefined4 *)
                                                     (*local_2058 +
                                                     ((long)(local_2144 - (int)local_2058[4]) +
                                                      (long)(local_2140 -
                                                            *(int *)((long)local_2058 + 0x24)) *
                                                      local_2058[1] +
                                                     (long)(local_213c - (int)local_2058[5]) *
                                                     local_2058[2]) * 4) =
                                                         *(undefined4 *)
                                                          (*local_2058 +
                                                          ((long)(local_2144 - (int)local_2058[4]) +
                                                           (long)(local_2140 -
                                                                 *(int *)((long)local_2058 + 0x24))
                                                           * local_2058[1] +
                                                          (long)(local_1d44 - (int)local_2058[5]) *
                                                          local_2058[2]) * 4);
                                                  }
                                                }
                                                else {
                                                  local_1d10 = (local_2140 + -1) - local_2094;
                                                  local_1d08 = local_2058;
                                                  local_1d0c = local_2144;
                                                  local_1d14 = local_213c;
                                                  local_1d20 = local_2058;
                                                  local_1d24 = local_2144;
                                                  local_1d28 = local_2140;
                                                  local_1d2c = local_213c;
                                                  *(undefined4 *)
                                                   (*local_2058 +
                                                   ((long)(local_2144 - (int)local_2058[4]) +
                                                    (long)(local_2140 -
                                                          *(int *)((long)local_2058 + 0x24)) *
                                                    local_2058[1] +
                                                   (long)(local_213c - (int)local_2058[5]) *
                                                   local_2058[2]) * 4) =
                                                       *(undefined4 *)
                                                        (*local_2058 +
                                                        ((long)(local_2144 - (int)local_2058[4]) +
                                                         (long)(local_1d10 -
                                                               *(int *)((long)local_2058 + 0x24)) *
                                                         local_2058[1] +
                                                        (long)(local_213c - (int)local_2058[5]) *
                                                        local_2058[2]) * 4);
                                                }
                                              }
                                              else {
LAB_016994ac:
                                                if ((local_2140 == local_20a0._4_4_ + -1) &&
                                                   (local_213c == local_20b8 + 1)) {
                                                  local_b68 = local_2068;
                                                  local_b6c = 1;
                                                  if ((local_2068[1] & 1) == 0) {
                                                    local_b78 = local_2070;
                                                    local_b7c = 2;
                                                    if ((local_2070[2] & 1) == 0) goto LAB_01699911;
                                                  }
                                                  local_b88 = local_2068;
                                                  local_b8c = 1;
                                                  if ((local_2068[1] & 1) != 0) {
                                                    local_b98 = local_2070;
                                                    local_b9c = 2;
                                                    if ((local_2070[2] & 1) != 0) {
                                                      local_1d70 = local_2140 + 1 + local_2094;
                                                      local_1d74 = (local_213c + -1) - local_2094;
                                                      local_1d68 = local_2058;
                                                      local_1d6c = local_2144;
                                                      local_1d80 = local_2058;
                                                      local_1d84 = local_2144;
                                                      local_1d88 = local_2140;
                                                      local_1d8c = local_213c;
                                                      *(undefined4 *)
                                                       (*local_2058 +
                                                       ((long)(local_2144 - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_213c - (int)local_2058[5]) *
                                                       local_2058[2]) * 4) =
                                                           *(undefined4 *)
                                                            (*local_2058 +
                                                            ((long)(local_2144 - (int)local_2058[4])
                                                             + (long)(local_1d70 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                            + (long)(local_1d74 - (int)local_2058[5]
                                                                    ) * local_2058[2]) * 4);
                                                      goto LAB_0169a549;
                                                    }
                                                  }
                                                  local_ba8 = local_2068;
                                                  local_bac = 1;
                                                  if ((local_2068[1] & 1) == 0) {
                                                    local_bb8 = local_2070;
                                                    local_bbc = 2;
                                                    if ((local_2070[2] & 1) != 0) {
                                                      local_1dd4 = (local_213c + -1) - local_2094;
                                                      local_1dc8 = local_2058;
                                                      local_1dcc = local_2144;
                                                      local_1dd0 = local_2140;
                                                      local_1de0 = local_2058;
                                                      local_1de4 = local_2144;
                                                      local_1de8 = local_2140;
                                                      local_1dec = local_213c;
                                                      *(undefined4 *)
                                                       (*local_2058 +
                                                       ((long)(local_2144 - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_213c - (int)local_2058[5]) *
                                                       local_2058[2]) * 4) =
                                                           *(undefined4 *)
                                                            (*local_2058 +
                                                            ((long)(local_2144 - (int)local_2058[4])
                                                             + (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                            + (long)(local_1dd4 - (int)local_2058[5]
                                                                    ) * local_2058[2]) * 4);
                                                    }
                                                  }
                                                  else {
                                                    local_1da0 = local_2140 + 1 + local_2094;
                                                    local_1d98 = local_2058;
                                                    local_1d9c = local_2144;
                                                    local_1da4 = local_213c;
                                                    local_1db0 = local_2058;
                                                    local_1db4 = local_2144;
                                                    local_1db8 = local_2140;
                                                    local_1dbc = local_213c;
                                                    *(undefined4 *)
                                                     (*local_2058 +
                                                     ((long)(local_2144 - (int)local_2058[4]) +
                                                      (long)(local_2140 -
                                                            *(int *)((long)local_2058 + 0x24)) *
                                                      local_2058[1] +
                                                     (long)(local_213c - (int)local_2058[5]) *
                                                     local_2058[2]) * 4) =
                                                         *(undefined4 *)
                                                          (*local_2058 +
                                                          ((long)(local_2144 - (int)local_2058[4]) +
                                                           (long)(local_1da0 -
                                                                 *(int *)((long)local_2058 + 0x24))
                                                           * local_2058[1] +
                                                          (long)(local_213c - (int)local_2058[5]) *
                                                          local_2058[2]) * 4);
                                                  }
                                                }
                                                else {
LAB_01699911:
                                                  if ((local_2140 == local_20c0._4_4_ + 1) &&
                                                     (local_213c == local_20b8 + 1)) {
                                                    local_bc8 = local_2070;
                                                    local_bcc = 1;
                                                    if ((local_2070[1] & 1) == 0) {
                                                      local_bd8 = local_2070;
                                                      local_bdc = 2;
                                                      if ((local_2070[2] & 1) == 0)
                                                      goto LAB_01699d76;
                                                    }
                                                    local_be8 = local_2070;
                                                    local_bec = 1;
                                                    if ((local_2070[1] & 1) != 0) {
                                                      local_bf8 = local_2070;
                                                      local_bfc = 2;
                                                      if ((local_2070[2] & 1) != 0) {
                                                        local_1e00 = (local_2140 + -1) - local_2094;
                                                        local_1e04 = (local_213c + -1) - local_2094;
                                                        local_1df8 = local_2058;
                                                        local_1dfc = local_2144;
                                                        local_1e10 = local_2058;
                                                        local_1e14 = local_2144;
                                                        local_1e18 = local_2140;
                                                        local_1e1c = local_213c;
                                                        *(undefined4 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 4) =
                                                             *(undefined4 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_1e00 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_1e04 -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 4);
                                                        goto LAB_0169a549;
                                                      }
                                                    }
                                                    local_c08 = local_2070;
                                                    local_c0c = 1;
                                                    if ((local_2070[1] & 1) == 0) {
                                                      local_c18 = local_2070;
                                                      local_c1c = 2;
                                                      if ((local_2070[2] & 1) != 0) {
                                                        local_1e64 = (local_213c + -1) - local_2094;
                                                        local_1e58 = local_2058;
                                                        local_1e5c = local_2144;
                                                        local_1e60 = local_2140;
                                                        local_1e70 = local_2058;
                                                        local_1e74 = local_2144;
                                                        local_1e78 = local_2140;
                                                        local_1e7c = local_213c;
                                                        *(undefined4 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 4) =
                                                             *(undefined4 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_1e64 -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 4);
                                                      }
                                                    }
                                                    else {
                                                      local_1e30 = (local_2140 + -1) - local_2094;
                                                      local_1e28 = local_2058;
                                                      local_1e2c = local_2144;
                                                      local_1e34 = local_213c;
                                                      local_1e40 = local_2058;
                                                      local_1e44 = local_2144;
                                                      local_1e48 = local_2140;
                                                      local_1e4c = local_213c;
                                                      *(undefined4 *)
                                                       (*local_2058 +
                                                       ((long)(local_2144 - (int)local_2058[4]) +
                                                        (long)(local_2140 -
                                                              *(int *)((long)local_2058 + 0x24)) *
                                                        local_2058[1] +
                                                       (long)(local_213c - (int)local_2058[5]) *
                                                       local_2058[2]) * 4) =
                                                           *(undefined4 *)
                                                            (*local_2058 +
                                                            ((long)(local_2144 - (int)local_2058[4])
                                                             + (long)(local_1e30 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                            + (long)(local_213c - (int)local_2058[5]
                                                                    ) * local_2058[2]) * 4);
                                                    }
                                                  }
                                                  else {
LAB_01699d76:
                                                    if (local_2144 == (int)local_20a0 + -1) {
                                                      local_c28 = local_2068;
                                                      local_c2c = 0;
                                                      if ((*local_2068 & 1) != 0) {
                                                        local_1e8c = local_2144 + 1 + local_2094;
                                                        local_1e88 = local_2058;
                                                        local_1e90 = local_2140;
                                                        local_1e94 = local_213c;
                                                        local_1ea0 = local_2058;
                                                        local_1ea4 = local_2144;
                                                        local_1ea8 = local_2140;
                                                        local_1eac = local_213c;
                                                        *(undefined4 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 4) =
                                                             *(undefined4 *)
                                                              (*local_2058 +
                                                              ((long)(local_1e8c -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_213c -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 4);
                                                        goto LAB_0169a549;
                                                      }
                                                    }
                                                    if (local_2144 == (int)local_20c0 + 1) {
                                                      local_c38 = local_2070;
                                                      local_c3c = 0;
                                                      if ((*local_2070 & 1) != 0) {
                                                        local_1ebc = (local_2144 + -1) - local_2094;
                                                        local_1eb8 = local_2058;
                                                        local_1ec0 = local_2140;
                                                        local_1ec4 = local_213c;
                                                        local_1ed0 = local_2058;
                                                        local_1ed4 = local_2144;
                                                        local_1ed8 = local_2140;
                                                        local_1edc = local_213c;
                                                        *(undefined4 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 4) =
                                                             *(undefined4 *)
                                                              (*local_2058 +
                                                              ((long)(local_1ebc -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_213c -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 4);
                                                        goto LAB_0169a549;
                                                      }
                                                    }
                                                    if (local_2140 == local_20a0._4_4_ + -1) {
                                                      local_c48 = local_2068;
                                                      local_c4c = 1;
                                                      if ((local_2068[1] & 1) != 0) {
                                                        local_1ef0 = local_2140 + 1 + local_2094;
                                                        local_1ee8 = local_2058;
                                                        local_1eec = local_2144;
                                                        local_1ef4 = local_213c;
                                                        local_1f00 = local_2058;
                                                        local_1f04 = local_2144;
                                                        local_1f08 = local_2140;
                                                        local_1f0c = local_213c;
                                                        *(undefined4 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 4) =
                                                             *(undefined4 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_1ef0 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_213c -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 4);
                                                        goto LAB_0169a549;
                                                      }
                                                    }
                                                    if (local_2140 == local_20c0._4_4_ + 1) {
                                                      local_c58 = local_2070;
                                                      local_c5c = 1;
                                                      if ((local_2070[1] & 1) != 0) {
                                                        local_1f20 = (local_2140 + -1) - local_2094;
                                                        local_1f18 = local_2058;
                                                        local_1f1c = local_2144;
                                                        local_1f24 = local_213c;
                                                        local_1f30 = local_2058;
                                                        local_1f34 = local_2144;
                                                        local_1f38 = local_2140;
                                                        local_1f3c = local_213c;
                                                        *(undefined4 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 4) =
                                                             *(undefined4 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_1f20 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_213c -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 4);
                                                        goto LAB_0169a549;
                                                      }
                                                    }
                                                    if (local_213c == local_2098 + -1) {
                                                      local_c68 = local_2068;
                                                      local_c6c = 2;
                                                      if ((local_2068[2] & 1) != 0) {
                                                        local_1f54 = local_213c + 1 + local_2094;
                                                        local_1f48 = local_2058;
                                                        local_1f4c = local_2144;
                                                        local_1f50 = local_2140;
                                                        local_1f60 = local_2058;
                                                        local_1f64 = local_2144;
                                                        local_1f68 = local_2140;
                                                        local_1f6c = local_213c;
                                                        *(undefined4 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 4) =
                                                             *(undefined4 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_1f54 -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 4);
                                                        goto LAB_0169a549;
                                                      }
                                                    }
                                                    if (local_213c == local_20b8 + 1) {
                                                      local_c78 = local_2070;
                                                      local_c7c = 2;
                                                      if ((local_2070[2] & 1) != 0) {
                                                        local_1f84 = (local_213c + -1) - local_2094;
                                                        local_1f78 = local_2058;
                                                        local_1f7c = local_2144;
                                                        local_1f80 = local_2140;
                                                        local_1f90 = local_2058;
                                                        local_1f94 = local_2144;
                                                        local_1f98 = local_2140;
                                                        local_1f9c = local_213c;
                                                        *(undefined4 *)
                                                         (*local_2058 +
                                                         ((long)(local_2144 - (int)local_2058[4]) +
                                                          (long)(local_2140 -
                                                                *(int *)((long)local_2058 + 0x24)) *
                                                          local_2058[1] +
                                                         (long)(local_213c - (int)local_2058[5]) *
                                                         local_2058[2]) * 4) =
                                                             *(undefined4 *)
                                                              (*local_2058 +
                                                              ((long)(local_2144 -
                                                                     (int)local_2058[4]) +
                                                               (long)(local_2140 -
                                                                     *(int *)((long)local_2058 +
                                                                             0x24)) * local_2058[1]
                                                              + (long)(local_1f84 -
                                                                      (int)local_2058[5]) *
                                                                local_2058[2]) * 4);
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_0169a549:
        }
      }
    }
  }
  return;
}

Assistant:

inline void mlndlap_bc_doit (Box const& vbx, Array4<T> const& a, Box const& domain,
                             GpuArray<bool,AMREX_SPACEDIM> const& bflo,
                             GpuArray<bool,AMREX_SPACEDIM> const& bfhi) noexcept
{
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (! bflo[idim]) gdomain.growLo(idim,1);
        if (! bfhi[idim]) gdomain.growHi(idim,1);
    }

    if (gdomain.strictly_contains(vbx)) return;

    const int offset = domain.cellCentered() ? 0 : 1;

    const auto dlo = amrex::lbound(domain);
    const auto dhi = amrex::ubound(domain);

    Box const& sbox = amrex::grow(vbx,1);
    AMREX_HOST_DEVICE_FOR_3D(sbox, i, j, k,
    {
        if (! gdomain.contains(IntVect(i,j,k))) {
            // xlo & ylo & zlo
            if (i == dlo.x-1 && j == dlo.y-1 && k == dlo.z-1 && (bflo[0] || bflo[1] || bflo[2]))
            {
                if (bflo[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k+1+offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & ylo & zlo
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dlo.z-1 && (bfhi[0] || bflo[1] || bflo[2]))
            {
                if (bfhi[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k+1+offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & yhi & zlo
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dlo.z-1 && (bflo[0] || bfhi[1] || bflo[2]))
            {
                if (bflo[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k+1+offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & yhi & zlo
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dlo.z-1 && (bfhi[0] || bfhi[1] || bflo[2]))
            {
                if (bfhi[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k+1+offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & ylo & zhi
            else if (i == dlo.x-1 && j == dlo.y-1 && k == dhi.z+1 && (bflo[0] || bflo[1] || bfhi[2]))
            {
                if (bflo[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k-1-offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & ylo & zhi
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dhi.z+1 && (bfhi[0] || bflo[1] || bfhi[2]))
            {
                if (bfhi[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k-1-offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & yhi & zhi
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dhi.z+1 && (bflo[0] || bfhi[1] || bfhi[2]))
            {
                if (bflo[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k-1-offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & yhi & zhi
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dhi.z+1 && (bfhi[0] || bfhi[1] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k-1-offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & ylo
            else if (i == dlo.x-1 && j == dlo.y-1 && (bflo[0] || bflo[1]))
            {
                if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xhi & ylo
            else if (i == dhi.x+1 && j == dlo.y-1 && (bfhi[0] || bflo[1]))
            {
                if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xlo & yhi
            else if (i == dlo.x-1 && j == dhi.y+1 && (bflo[0] || bfhi[1]))
            {
                if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xhi & yhi
            else if (i == dhi.x+1 && j == dhi.y+1 && (bfhi[0] || bfhi[1]))
            {
                if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xlo & zlo
            else if (i == dlo.x-1 && k == dlo.z-1 && (bflo[0] || bflo[2]))
            {
                if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & zlo
            else if (i == dhi.x+1 && k == dlo.z-1 && (bfhi[0] || bflo[2]))
            {
                if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & zhi
            else if (i == dlo.x-1 && k == dhi.z+1 && (bflo[0] || bfhi[2]))
            {
                if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & zhi
            else if (i == dhi.x+1 && k == dhi.z+1 && (bfhi[0] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // ylo & zlo
            else if (j == dlo.y-1 && k == dlo.z-1 && (bflo[1] || bflo[2]))
            {
                if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // yhi & zlo
            else if (j == dhi.y+1 && k == dlo.z-1 && (bfhi[1] || bflo[2]))
            {
                if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // ylo & zhi
            else if (j == dlo.y-1 && k == dhi.z+1 && (bflo[1] || bfhi[2]))
            {
                if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // yhi & zhi
            else if (j == dhi.y+1 && k == dhi.z+1 && (bfhi[1] || bfhi[2]))
            {
                if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            else if (i == dlo.x-1 && bflo[0])
            {
                a(i,j,k) = a(i+1+offset, j, k);
            }
            else if (i == dhi.x+1 && bfhi[0])
            {
                a(i,j,k) = a(i-1-offset, j, k);
            }
            else if (j == dlo.y-1 && bflo[1])
            {
                a(i,j,k) = a(i, j+1+offset, k);
            }
            else if (j == dhi.y+1 && bfhi[1])
            {
                a(i,j,k) = a(i, j-1-offset, k);
            }
            else if (k == dlo.z-1 && bflo[2])
            {
                a(i,j,k) = a(i, j, k+1+offset);
            }
            else if (k == dhi.z+1 && bfhi[2])
            {
                a(i,j,k) = a(i, j, k-1-offset);
            }
        }
    });
}